

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float fVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  ulong uVar61;
  byte bVar62;
  byte bVar63;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar64;
  ulong uVar65;
  byte bVar66;
  byte bVar67;
  uint uVar68;
  ulong uVar69;
  byte bVar70;
  byte bVar71;
  long lVar72;
  undefined1 uVar73;
  bool bVar74;
  undefined1 uVar75;
  bool bVar76;
  uint uVar77;
  uint uVar140;
  uint uVar141;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar142;
  uint uVar146;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar86 [16];
  undefined1 auVar139 [32];
  float pp;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar165;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar166;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined4 uVar228;
  float fVar229;
  float fVar236;
  float fVar237;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar238;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  float fVar240;
  undefined1 auVar241 [32];
  float fVar243;
  undefined1 auVar242 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar248;
  float fVar249;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  RTCHitN local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 local_140;
  float local_138 [66];
  
  PVar2 = prim[1];
  uVar61 = (ulong)(byte)PVar2;
  fVar1 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar84 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar86 = vsubps_avx(auVar18,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  fVar209 = fVar1 * auVar86._0_4_;
  fVar147 = fVar1 * auVar84._0_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar61 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar18);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar61 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar19);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar61 * 6 + 6);
  auVar93 = vpmovsxbd_avx2(auVar80);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar94 = vpmovsxbd_avx2(auVar81);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar95 = vpmovsxbd_avx2(auVar78);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar61 + 6);
  auVar96 = vpmovsxbd_avx2(auVar82);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar69 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 + uVar61 + 6);
  auVar100 = vpmovsxbd_avx2(auVar79);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar100);
  uVar65 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar89 = vpmovsxbd_avx2(auVar83);
  auVar99 = vcvtdq2ps_avx(auVar89);
  auVar107._4_4_ = fVar147;
  auVar107._0_4_ = fVar147;
  auVar107._8_4_ = fVar147;
  auVar107._12_4_ = fVar147;
  auVar107._16_4_ = fVar147;
  auVar107._20_4_ = fVar147;
  auVar107._24_4_ = fVar147;
  auVar107._28_4_ = fVar147;
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  auVar101 = ZEXT1632(CONCAT412(fVar1 * auVar84._12_4_,
                                CONCAT48(fVar1 * auVar84._8_4_,
                                         CONCAT44(fVar1 * auVar84._4_4_,fVar147))));
  auVar90 = vpermps_avx2(auVar109,auVar101);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = vpermps_avx512vl(auVar87,auVar101);
  fVar147 = auVar88._0_4_;
  fVar229 = auVar88._4_4_;
  auVar101._4_4_ = fVar229 * auVar93._4_4_;
  auVar101._0_4_ = fVar147 * auVar93._0_4_;
  fVar236 = auVar88._8_4_;
  auVar101._8_4_ = fVar236 * auVar93._8_4_;
  fVar237 = auVar88._12_4_;
  auVar101._12_4_ = fVar237 * auVar93._12_4_;
  fVar238 = auVar88._16_4_;
  auVar101._16_4_ = fVar238 * auVar93._16_4_;
  fVar243 = auVar88._20_4_;
  auVar101._20_4_ = fVar243 * auVar93._20_4_;
  fVar239 = auVar88._24_4_;
  auVar101._24_4_ = fVar239 * auVar93._24_4_;
  auVar101._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar96._4_4_ * fVar229;
  auVar100._0_4_ = auVar96._0_4_ * fVar147;
  auVar100._8_4_ = auVar96._8_4_ * fVar236;
  auVar100._12_4_ = auVar96._12_4_ * fVar237;
  auVar100._16_4_ = auVar96._16_4_ * fVar238;
  auVar100._20_4_ = auVar96._20_4_ * fVar243;
  auVar100._24_4_ = auVar96._24_4_ * fVar239;
  auVar100._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar99._4_4_ * fVar229;
  auVar89._0_4_ = auVar99._0_4_ * fVar147;
  auVar89._8_4_ = auVar99._8_4_ * fVar236;
  auVar89._12_4_ = auVar99._12_4_ * fVar237;
  auVar89._16_4_ = auVar99._16_4_ * fVar238;
  auVar89._20_4_ = auVar99._20_4_ * fVar243;
  auVar89._24_4_ = auVar99._24_4_ * fVar239;
  auVar89._28_4_ = auVar88._28_4_;
  auVar18 = vfmadd231ps_fma(auVar101,auVar90,auVar91);
  auVar19 = vfmadd231ps_fma(auVar100,auVar90,auVar95);
  auVar80 = vfmadd231ps_fma(auVar89,auVar98,auVar90);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar107,auVar92);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar107,auVar94);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar97,auVar107);
  auVar108._4_4_ = fVar209;
  auVar108._0_4_ = fVar209;
  auVar108._8_4_ = fVar209;
  auVar108._12_4_ = fVar209;
  auVar108._16_4_ = fVar209;
  auVar108._20_4_ = fVar209;
  auVar108._24_4_ = fVar209;
  auVar108._28_4_ = fVar209;
  auVar89 = ZEXT1632(CONCAT412(fVar1 * auVar86._12_4_,
                               CONCAT48(fVar1 * auVar86._8_4_,
                                        CONCAT44(fVar1 * auVar86._4_4_,fVar209))));
  auVar100 = vpermps_avx2(auVar109,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  auVar90 = vmulps_avx512vl(auVar89,auVar93);
  auVar103._0_4_ = auVar89._0_4_ * auVar96._0_4_;
  auVar103._4_4_ = auVar89._4_4_ * auVar96._4_4_;
  auVar103._8_4_ = auVar89._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar89._12_4_ * auVar96._12_4_;
  auVar103._16_4_ = auVar89._16_4_ * auVar96._16_4_;
  auVar103._20_4_ = auVar89._20_4_ * auVar96._20_4_;
  auVar103._24_4_ = auVar89._24_4_ * auVar96._24_4_;
  auVar103._28_4_ = 0;
  auVar96._4_4_ = auVar89._4_4_ * auVar99._4_4_;
  auVar96._0_4_ = auVar89._0_4_ * auVar99._0_4_;
  auVar96._8_4_ = auVar89._8_4_ * auVar99._8_4_;
  auVar96._12_4_ = auVar89._12_4_ * auVar99._12_4_;
  auVar96._16_4_ = auVar89._16_4_ * auVar99._16_4_;
  auVar96._20_4_ = auVar89._20_4_ * auVar99._20_4_;
  auVar96._24_4_ = auVar89._24_4_ * auVar99._24_4_;
  auVar96._28_4_ = auVar93._28_4_;
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar100,auVar91);
  auVar81 = vfmadd231ps_fma(auVar103,auVar100,auVar95);
  auVar78 = vfmadd231ps_fma(auVar96,auVar100,auVar98);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar92);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar108,auVar94);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar108,auVar97);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar253 = ZEXT3264(auVar92);
  vandps_avx512vl(ZEXT1632(auVar18),auVar92);
  auVar105._8_4_ = 0x219392ef;
  auVar105._0_8_ = 0x219392ef219392ef;
  auVar105._12_4_ = 0x219392ef;
  auVar105._16_4_ = 0x219392ef;
  auVar105._20_4_ = 0x219392ef;
  auVar105._24_4_ = 0x219392ef;
  auVar105._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar92,auVar105,1);
  bVar76 = (bool)((byte)uVar69 & 1);
  auVar90._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar18._0_4_;
  bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar18._4_4_;
  bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar18._8_4_;
  bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar18._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar19),auVar92);
  uVar69 = vcmpps_avx512vl(auVar90,auVar105,1);
  bVar76 = (bool)((byte)uVar69 & 1);
  auVar87._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar19._0_4_;
  bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar19._4_4_;
  bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar19._8_4_;
  bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar19._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar80),auVar92);
  uVar69 = vcmpps_avx512vl(auVar87,auVar105,1);
  bVar76 = (bool)((byte)uVar69 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._0_4_;
  bVar76 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._4_4_;
  bVar76 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._8_4_;
  bVar76 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar90);
  auVar106._8_4_ = 0x3f800000;
  auVar106._0_8_ = &DAT_3f8000003f800000;
  auVar106._12_4_ = 0x3f800000;
  auVar106._16_4_ = 0x3f800000;
  auVar106._20_4_ = 0x3f800000;
  auVar106._24_4_ = 0x3f800000;
  auVar106._28_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar90,auVar93,auVar106);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar87);
  auVar19 = vfnmadd213ps_fma(auVar87,auVar93,auVar106);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar92);
  auVar80 = vfnmadd213ps_fma(auVar92,auVar93,auVar106);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar93,auVar93);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vsubps_avx512vl(auVar92,auVar91);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 9 + 6));
  auVar97._4_4_ = auVar18._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar18._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar18._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar18._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx512vl(auVar92,auVar91);
  auVar104._0_4_ = auVar18._0_4_ * auVar92._0_4_;
  auVar104._4_4_ = auVar18._4_4_ * auVar92._4_4_;
  auVar104._8_4_ = auVar18._8_4_ * auVar92._8_4_;
  auVar104._12_4_ = auVar18._12_4_ * auVar92._12_4_;
  auVar104._16_4_ = auVar92._16_4_ * 0.0;
  auVar104._20_4_ = auVar92._20_4_ * 0.0;
  auVar104._24_4_ = auVar92._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar61 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar81));
  auVar98._4_4_ = auVar19._4_4_ * auVar92._4_4_;
  auVar98._0_4_ = auVar19._0_4_ * auVar92._0_4_;
  auVar98._8_4_ = auVar19._8_4_ * auVar92._8_4_;
  auVar98._12_4_ = auVar19._12_4_ * auVar92._12_4_;
  auVar98._16_4_ = auVar92._16_4_ * 0.0;
  auVar98._20_4_ = auVar92._20_4_ * 0.0;
  auVar98._24_4_ = auVar92._24_4_ * 0.0;
  auVar98._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar81));
  auVar102._0_4_ = auVar19._0_4_ * auVar92._0_4_;
  auVar102._4_4_ = auVar19._4_4_ * auVar92._4_4_;
  auVar102._8_4_ = auVar19._8_4_ * auVar92._8_4_;
  auVar102._12_4_ = auVar19._12_4_ * auVar92._12_4_;
  auVar102._16_4_ = auVar92._16_4_ * 0.0;
  auVar102._20_4_ = auVar92._20_4_ * 0.0;
  auVar102._24_4_ = auVar92._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 + uVar61 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar78));
  auVar99._4_4_ = auVar92._4_4_ * auVar80._4_4_;
  auVar99._0_4_ = auVar92._0_4_ * auVar80._0_4_;
  auVar99._8_4_ = auVar92._8_4_ * auVar80._8_4_;
  auVar99._12_4_ = auVar92._12_4_ * auVar80._12_4_;
  auVar99._16_4_ = auVar92._16_4_ * 0.0;
  auVar99._20_4_ = auVar92._20_4_ * 0.0;
  auVar99._24_4_ = auVar92._24_4_ * 0.0;
  auVar99._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar78));
  auVar88._0_4_ = auVar80._0_4_ * auVar92._0_4_;
  auVar88._4_4_ = auVar80._4_4_ * auVar92._4_4_;
  auVar88._8_4_ = auVar80._8_4_ * auVar92._8_4_;
  auVar88._12_4_ = auVar80._12_4_ * auVar92._12_4_;
  auVar88._16_4_ = auVar92._16_4_ * 0.0;
  auVar88._20_4_ = auVar92._20_4_ * 0.0;
  auVar88._24_4_ = auVar92._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar97,auVar104);
  auVar91 = vpminsd_avx2(auVar98,auVar102);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar88);
  uVar228 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar93._4_4_ = uVar228;
  auVar93._0_4_ = uVar228;
  auVar93._8_4_ = uVar228;
  auVar93._12_4_ = uVar228;
  auVar93._16_4_ = uVar228;
  auVar93._20_4_ = uVar228;
  auVar93._24_4_ = uVar228;
  auVar93._28_4_ = uVar228;
  auVar91 = vmaxps_avx512vl(auVar91,auVar93);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_240 = vmulps_avx512vl(auVar92,auVar91);
  auVar92 = vpmaxsd_avx2(auVar97,auVar104);
  auVar91 = vpmaxsd_avx2(auVar98,auVar102);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar88);
  uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar228;
  auVar94._0_4_ = uVar228;
  auVar94._8_4_ = uVar228;
  auVar94._12_4_ = uVar228;
  auVar94._16_4_ = uVar228;
  auVar94._20_4_ = uVar228;
  auVar94._24_4_ = uVar228;
  auVar94._28_4_ = uVar228;
  auVar91 = vminps_avx512vl(auVar91,auVar94);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar95);
  auVar91 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar91,_DAT_0205a920);
  uVar21 = vcmpps_avx512vl(local_240,auVar92,2);
  bVar74 = (byte)((byte)uVar21 & (byte)uVar23) == 0;
  bVar76 = !bVar74;
  if (bVar74) {
    return bVar76;
  }
  uVar69 = (ulong)(byte)((byte)uVar21 & (byte)uVar23);
  local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01dea13f:
  lVar72 = 0;
  for (uVar61 = uVar69; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar68 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar68].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar72 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar72 = *(long *)&pGVar3[1].time_range.upper;
  auVar18 = *(undefined1 (*) [16])(lVar72 + (long)p_Var4 * uVar61);
  auVar19 = *(undefined1 (*) [16])(lVar72 + (uVar61 + 1) * (long)p_Var4);
  auVar80 = *(undefined1 (*) [16])(lVar72 + (uVar61 + 2) * (long)p_Var4);
  uVar69 = uVar69 - 1 & uVar69;
  auVar81 = *(undefined1 (*) [16])(lVar72 + (uVar61 + 3) * (long)p_Var4);
  if (uVar69 != 0) {
    uVar65 = uVar69 - 1 & uVar69;
    for (uVar61 = uVar69; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar94 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar78 = vunpcklps_avx512vl(auVar93._0_16_,auVar94._0_16_);
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar250._4_4_ = fVar1;
  auVar250._0_4_ = fVar1;
  auVar250._8_4_ = fVar1;
  auVar250._12_4_ = fVar1;
  local_520._16_4_ = fVar1;
  local_520._0_16_ = auVar250;
  local_520._20_4_ = fVar1;
  local_520._24_4_ = fVar1;
  local_520._28_4_ = fVar1;
  local_750 = vinsertps_avx(auVar78,auVar250,0x28);
  auVar86._0_4_ = auVar18._0_4_ + auVar19._0_4_ + auVar80._0_4_ + auVar81._0_4_;
  auVar86._4_4_ = auVar18._4_4_ + auVar19._4_4_ + auVar80._4_4_ + auVar81._4_4_;
  auVar86._8_4_ = auVar18._8_4_ + auVar19._8_4_ + auVar80._8_4_ + auVar81._8_4_;
  auVar86._12_4_ = auVar18._12_4_ + auVar19._12_4_ + auVar80._12_4_ + auVar81._12_4_;
  auVar84._8_4_ = 0x3e800000;
  auVar84._0_8_ = 0x3e8000003e800000;
  auVar84._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar86,auVar84);
  auVar78 = vsubps_avx(auVar78,auVar82);
  auVar78 = vdpps_avx(auVar78,local_750,0x7f);
  fVar147 = *(float *)(ray + k * 4 + 0x60);
  local_770 = vdpps_avx(local_750,local_750,0x7f);
  auVar230._4_12_ = ZEXT812(0) << 0x20;
  auVar230._0_4_ = local_770._0_4_;
  auVar79 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar230);
  auVar85 = vfnmadd213ss_fma(auVar79,local_770,ZEXT416(0x40000000));
  local_200 = auVar78._0_4_ * auVar79._0_4_ * auVar85._0_4_;
  auVar231._4_4_ = local_200;
  auVar231._0_4_ = local_200;
  auVar231._8_4_ = local_200;
  auVar231._12_4_ = local_200;
  fStack_4f0 = local_200;
  _local_500 = auVar231;
  fStack_4ec = local_200;
  fStack_4e8 = local_200;
  fStack_4e4 = local_200;
  auVar78 = vfmadd231ps_fma(auVar82,local_750,auVar231);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar18 = vsubps_avx(auVar18,auVar78);
  auVar80 = vsubps_avx(auVar80,auVar78);
  auVar19 = vsubps_avx(auVar19,auVar78);
  auVar81 = vsubps_avx(auVar81,auVar78);
  uVar228 = auVar18._0_4_;
  auVar242._4_4_ = uVar228;
  auVar242._0_4_ = uVar228;
  auVar242._8_4_ = uVar228;
  auVar242._12_4_ = uVar228;
  auVar242._16_4_ = uVar228;
  auVar242._20_4_ = uVar228;
  auVar242._24_4_ = uVar228;
  auVar242._28_4_ = uVar228;
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_5a0 = ZEXT1632(auVar18);
  auVar92 = vpermps_avx2(auVar110,local_5a0);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  auVar95 = vpermps_avx512vl(auVar111,local_5a0);
  auVar112._8_4_ = 3;
  auVar112._0_8_ = 0x300000003;
  auVar112._12_4_ = 3;
  auVar112._16_4_ = 3;
  auVar112._20_4_ = 3;
  auVar112._24_4_ = 3;
  auVar112._28_4_ = 3;
  auVar91 = vpermps_avx2(auVar112,local_5a0);
  uVar228 = auVar19._0_4_;
  local_620._4_4_ = uVar228;
  local_620._0_4_ = uVar228;
  local_620._8_4_ = uVar228;
  local_620._12_4_ = uVar228;
  local_620._16_4_ = uVar228;
  local_620._20_4_ = uVar228;
  local_620._24_4_ = uVar228;
  local_620._28_4_ = uVar228;
  local_5e0 = ZEXT1632(auVar19);
  local_7c0 = vpermps_avx2(auVar110,local_5e0);
  auVar96 = vpermps_avx512vl(auVar111,local_5e0);
  auVar97 = vpermps_avx512vl(auVar112,local_5e0);
  local_720 = vbroadcastss_avx512vl(auVar80);
  auVar251 = ZEXT3264(local_720);
  local_5c0 = ZEXT1632(auVar80);
  local_740 = vpermps_avx512vl(auVar110,local_5c0);
  auVar252 = ZEXT3264(local_740);
  auVar98 = vpermps_avx512vl(auVar111,local_5c0);
  local_220 = vpermps_avx512vl(auVar112,local_5c0);
  auVar99 = vbroadcastss_avx512vl(auVar81);
  _local_600 = ZEXT1632(auVar81);
  auVar100 = vpermps_avx512vl(auVar110,_local_600);
  auVar89 = vpermps_avx512vl(auVar111,_local_600);
  auVar90 = vpermps_avx512vl(auVar112,_local_600);
  auVar208 = ZEXT3264(local_620);
  auVar224 = ZEXT3264(local_7c0);
  auVar101 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar1 * fVar1)),auVar94,auVar94);
  local_3e0 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar93);
  local_1e0._0_4_ = local_3e0._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  vandps_avx512vl(local_1e0,auVar253._0_32_);
  local_670 = ZEXT416((uint)local_200);
  local_200 = fVar147 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  local_420 = vpbroadcastd_avx512vl();
  fVar1 = 1.4013e-45;
  uVar61 = 0;
  bVar70 = 0;
  local_440 = vpbroadcastd_avx512vl();
  auVar18 = vsqrtss_avx(local_770,local_770);
  auVar19 = vsqrtss_avx(local_770,local_770);
  local_690 = ZEXT816(0x3f80000000000000);
  auVar217 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar80 = vmovshdup_avx(local_690);
    auVar227._0_4_ = local_690._0_4_;
    fVar229 = auVar80._0_4_ - auVar227._0_4_;
    fVar243 = fVar229 * 0.04761905;
    auVar227._4_4_ = auVar227._0_4_;
    auVar227._8_4_ = auVar227._0_4_;
    auVar227._12_4_ = auVar227._0_4_;
    auVar227._16_4_ = auVar227._0_4_;
    auVar227._20_4_ = auVar227._0_4_;
    auVar227._24_4_ = auVar227._0_4_;
    auVar227._28_4_ = auVar227._0_4_;
    local_7a0._4_4_ = fVar229;
    local_7a0._0_4_ = fVar229;
    local_7a0._8_4_ = fVar229;
    local_7a0._12_4_ = fVar229;
    local_7a0._16_4_ = fVar229;
    local_7a0._20_4_ = fVar229;
    local_7a0._24_4_ = fVar229;
    local_7a0._28_4_ = fVar229;
    auVar80 = vfmadd231ps_fma(auVar227,local_7a0,_DAT_02020f20);
    auVar125 = auVar217._0_32_;
    auVar101 = vsubps_avx(auVar125,ZEXT1632(auVar80));
    fVar229 = auVar80._0_4_;
    auVar130._0_4_ = auVar208._0_4_ * fVar229;
    fVar236 = auVar80._4_4_;
    auVar130._4_4_ = auVar208._4_4_ * fVar236;
    fVar237 = auVar80._8_4_;
    auVar130._8_4_ = auVar208._8_4_ * fVar237;
    fVar238 = auVar80._12_4_;
    auVar130._12_4_ = auVar208._12_4_ * fVar238;
    auVar130._16_4_ = auVar208._16_4_ * 0.0;
    auVar130._20_4_ = auVar208._20_4_ * 0.0;
    auVar130._24_4_ = auVar208._24_4_ * 0.0;
    auVar130._28_4_ = 0;
    auVar102 = ZEXT1632(auVar80);
    auVar253._0_4_ = auVar224._0_4_ * fVar229;
    auVar253._4_4_ = auVar224._4_4_ * fVar236;
    auVar253._8_4_ = auVar224._8_4_ * fVar237;
    auVar253._12_4_ = auVar224._12_4_ * fVar238;
    auVar253._16_4_ = auVar224._16_4_ * 0.0;
    auVar253._20_4_ = auVar224._20_4_ * 0.0;
    auVar253._28_36_ = auVar208._28_36_;
    auVar253._24_4_ = auVar224._24_4_ * 0.0;
    auVar87 = vmulps_avx512vl(auVar96,auVar102);
    auVar88 = vmulps_avx512vl(auVar97,auVar102);
    auVar81 = vfmadd231ps_fma(auVar130,auVar101,auVar242);
    auVar78 = vfmadd231ps_fma(auVar253._0_32_,auVar101,auVar92);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar95);
    auVar82 = vfmadd231ps_fma(auVar88,auVar101,auVar91);
    auVar88 = vmulps_avx512vl(auVar251._0_32_,auVar102);
    auVar108 = ZEXT1632(auVar80);
    auVar102 = vmulps_avx512vl(auVar252._0_32_,auVar108);
    auVar103 = vmulps_avx512vl(auVar98,auVar108);
    auVar104 = vmulps_avx512vl(local_220,auVar108);
    auVar85 = vfmadd231ps_fma(auVar88,auVar101,auVar208._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar224._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar96);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar97);
    auVar104 = vmulps_avx512vl(auVar99,auVar108);
    auVar105 = vmulps_avx512vl(auVar100,auVar108);
    auVar106 = vmulps_avx512vl(auVar89,auVar108);
    auVar107 = vmulps_avx512vl(auVar90,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar251._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar252._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar98);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,local_220);
    auVar108 = vmulps_avx512vl(auVar108,ZEXT1632(auVar85));
    auVar112 = ZEXT1632(auVar80);
    auVar109 = vmulps_avx512vl(auVar112,auVar88);
    auVar110 = vmulps_avx512vl(auVar112,auVar102);
    auVar111 = vmulps_avx512vl(auVar112,auVar103);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,ZEXT1632(auVar81));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,ZEXT1632(auVar78));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar87);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,ZEXT1632(auVar82));
    auVar179._0_4_ = auVar104._0_4_ * fVar229;
    auVar179._4_4_ = auVar104._4_4_ * fVar236;
    auVar179._8_4_ = auVar104._8_4_ * fVar237;
    auVar179._12_4_ = auVar104._12_4_ * fVar238;
    auVar179._16_4_ = auVar104._16_4_ * 0.0;
    auVar179._20_4_ = auVar104._20_4_ * 0.0;
    auVar179._24_4_ = auVar104._24_4_ * 0.0;
    auVar179._28_4_ = 0;
    auVar113._4_4_ = auVar105._4_4_ * fVar236;
    auVar113._0_4_ = auVar105._0_4_ * fVar229;
    auVar113._8_4_ = auVar105._8_4_ * fVar237;
    auVar113._12_4_ = auVar105._12_4_ * fVar238;
    auVar113._16_4_ = auVar105._16_4_ * 0.0;
    auVar113._20_4_ = auVar105._20_4_ * 0.0;
    auVar113._24_4_ = auVar105._24_4_ * 0.0;
    auVar113._28_4_ = auVar104._28_4_;
    auVar119._4_4_ = auVar106._4_4_ * fVar236;
    auVar119._0_4_ = auVar106._0_4_ * fVar229;
    auVar119._8_4_ = auVar106._8_4_ * fVar237;
    auVar119._12_4_ = auVar106._12_4_ * fVar238;
    auVar119._16_4_ = auVar106._16_4_ * 0.0;
    auVar119._20_4_ = auVar106._20_4_ * 0.0;
    auVar119._24_4_ = auVar106._24_4_ * 0.0;
    auVar119._28_4_ = auVar105._28_4_;
    auVar120._4_4_ = auVar107._4_4_ * fVar236;
    auVar120._0_4_ = auVar107._0_4_ * fVar229;
    auVar120._8_4_ = auVar107._8_4_ * fVar237;
    auVar120._12_4_ = auVar107._12_4_ * fVar238;
    auVar120._16_4_ = auVar107._16_4_ * 0.0;
    auVar120._20_4_ = auVar107._20_4_ * 0.0;
    auVar120._24_4_ = auVar107._24_4_ * 0.0;
    auVar120._28_4_ = auVar106._28_4_;
    auVar80 = vfmadd231ps_fma(auVar179,auVar101,ZEXT1632(auVar85));
    auVar81 = vfmadd231ps_fma(auVar113,auVar101,auVar88);
    auVar78 = vfmadd231ps_fma(auVar119,auVar101,auVar102);
    auVar82 = vfmadd231ps_fma(auVar120,auVar101,auVar103);
    auVar121._28_4_ = auVar87._28_4_;
    auVar121._0_28_ =
         ZEXT1628(CONCAT412(auVar81._12_4_ * fVar238,
                            CONCAT48(auVar81._8_4_ * fVar237,
                                     CONCAT44(auVar81._4_4_ * fVar236,auVar81._0_4_ * fVar229))));
    auVar87 = vmulps_avx512vl(auVar112,ZEXT1632(auVar78));
    auVar104 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar238 * auVar80._12_4_,
                                             CONCAT48(fVar237 * auVar80._8_4_,
                                                      CONCAT44(fVar236 * auVar80._4_4_,
                                                               fVar229 * auVar80._0_4_)))),auVar101,
                          auVar108);
    auVar105 = vfmadd231ps_avx512vl(auVar121,auVar101,auVar109);
    local_540 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar110);
    auVar88 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar82._12_4_ * fVar238,
                                            CONCAT48(auVar82._8_4_ * fVar237,
                                                     CONCAT44(auVar82._4_4_ * fVar236,
                                                              auVar82._0_4_ * fVar229)))),auVar111,
                         auVar101);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar80),auVar108);
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar81),auVar109);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar78),auVar110);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar82),auVar111);
    auVar126._4_4_ = fVar243 * auVar101._4_4_ * 3.0;
    auVar126._0_4_ = fVar243 * auVar101._0_4_ * 3.0;
    auVar126._8_4_ = fVar243 * auVar101._8_4_ * 3.0;
    auVar126._12_4_ = fVar243 * auVar101._12_4_ * 3.0;
    auVar126._16_4_ = fVar243 * auVar101._16_4_ * 3.0;
    auVar126._20_4_ = fVar243 * auVar101._20_4_ * 3.0;
    auVar126._24_4_ = fVar243 * auVar101._24_4_ * 3.0;
    auVar126._28_4_ = auVar103._28_4_;
    auVar245._0_4_ = fVar243 * auVar87._0_4_ * 3.0;
    auVar245._4_4_ = fVar243 * auVar87._4_4_ * 3.0;
    auVar245._8_4_ = fVar243 * auVar87._8_4_ * 3.0;
    auVar245._12_4_ = fVar243 * auVar87._12_4_ * 3.0;
    auVar245._16_4_ = fVar243 * auVar87._16_4_ * 3.0;
    auVar245._20_4_ = fVar243 * auVar87._20_4_ * 3.0;
    auVar245._24_4_ = fVar243 * auVar87._24_4_ * 3.0;
    auVar245._28_4_ = 0;
    auVar246._0_4_ = auVar102._0_4_ * 3.0 * fVar243;
    auVar246._4_4_ = auVar102._4_4_ * 3.0 * fVar243;
    auVar246._8_4_ = auVar102._8_4_ * 3.0 * fVar243;
    auVar246._12_4_ = auVar102._12_4_ * 3.0 * fVar243;
    auVar246._16_4_ = auVar102._16_4_ * 3.0 * fVar243;
    auVar246._20_4_ = auVar102._20_4_ * 3.0 * fVar243;
    auVar246._24_4_ = auVar102._24_4_ * 3.0 * fVar243;
    auVar246._28_4_ = 0;
    fVar229 = auVar106._0_4_ * 3.0 * fVar243;
    fVar236 = auVar106._4_4_ * 3.0 * fVar243;
    auVar122._4_4_ = fVar236;
    auVar122._0_4_ = fVar229;
    fVar237 = auVar106._8_4_ * 3.0 * fVar243;
    auVar122._8_4_ = fVar237;
    fVar238 = auVar106._12_4_ * 3.0 * fVar243;
    auVar122._12_4_ = fVar238;
    fVar239 = auVar106._16_4_ * 3.0 * fVar243;
    auVar122._16_4_ = fVar239;
    fVar209 = auVar106._20_4_ * 3.0 * fVar243;
    auVar122._20_4_ = fVar209;
    fVar240 = auVar106._24_4_ * 3.0 * fVar243;
    auVar122._24_4_ = fVar240;
    auVar122._28_4_ = fVar243;
    auVar80 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar103 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar80));
    auVar106 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,ZEXT1632(auVar80));
    auVar102 = ZEXT1632(auVar80);
    auVar107 = vpermt2ps_avx512vl(local_540,_DAT_0205fd20,auVar102);
    auVar180._0_4_ = auVar88._0_4_ + fVar229;
    auVar180._4_4_ = auVar88._4_4_ + fVar236;
    auVar180._8_4_ = auVar88._8_4_ + fVar237;
    auVar180._12_4_ = auVar88._12_4_ + fVar238;
    auVar180._16_4_ = auVar88._16_4_ + fVar239;
    auVar180._20_4_ = auVar88._20_4_ + fVar209;
    auVar180._24_4_ = auVar88._24_4_ + fVar240;
    auVar180._28_4_ = auVar88._28_4_ + fVar243;
    auVar101 = vmaxps_avx(auVar88,auVar180);
    auVar87 = vminps_avx(auVar88,auVar180);
    auVar108 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar102);
    auVar109 = vpermt2ps_avx512vl(auVar126,_DAT_0205fd20,auVar102);
    auVar110 = vpermt2ps_avx512vl(auVar245,_DAT_0205fd20,auVar102);
    auVar130 = ZEXT1632(auVar80);
    auVar111 = vpermt2ps_avx512vl(auVar246,_DAT_0205fd20,auVar130);
    auVar88 = vpermt2ps_avx512vl(auVar122,_DAT_0205fd20,auVar130);
    auVar112 = vsubps_avx512vl(auVar108,auVar88);
    auVar88 = vsubps_avx(auVar103,auVar104);
    auVar102 = vsubps_avx(auVar106,auVar105);
    auVar113 = vsubps_avx512vl(auVar107,local_540);
    auVar114 = vmulps_avx512vl(auVar102,auVar246);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar245,auVar113);
    auVar115 = vmulps_avx512vl(auVar113,auVar126);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar246,auVar88);
    auVar116 = vmulps_avx512vl(auVar88,auVar245);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar126,auVar102);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar102,auVar102);
    auVar117 = vfmadd231ps_avx512vl(auVar115,auVar88,auVar88);
    auVar115 = vrcp14ps_avx512vl(auVar117);
    auVar116 = vfnmadd213ps_avx512vl(auVar115,auVar117,auVar125);
    auVar115 = vfmadd132ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vmulps_avx512vl(auVar114,auVar115);
    auVar116 = vmulps_avx512vl(auVar102,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar110,auVar113);
    auVar118 = vmulps_avx512vl(auVar113,auVar109);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar111,auVar88);
    auVar119 = vmulps_avx512vl(auVar88,auVar110);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar109,auVar102);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar116 = vfmadd231ps_avx512vl(auVar118,auVar116,auVar116);
    auVar115 = vmulps_avx512vl(auVar116,auVar115);
    auVar114 = vmaxps_avx512vl(auVar114,auVar115);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar115 = vmaxps_avx512vl(auVar112,auVar108);
    auVar101 = vmaxps_avx512vl(auVar101,auVar115);
    auVar115 = vaddps_avx512vl(auVar114,auVar101);
    auVar101 = vminps_avx512vl(auVar112,auVar108);
    auVar101 = vminps_avx(auVar87,auVar101);
    auVar101 = vsubps_avx512vl(auVar101,auVar114);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar87 = vmulps_avx512vl(auVar115,auVar114);
    auVar115._8_4_ = 0x3f7ffffc;
    auVar115._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar115._12_4_ = 0x3f7ffffc;
    auVar115._16_4_ = 0x3f7ffffc;
    auVar115._20_4_ = 0x3f7ffffc;
    auVar115._24_4_ = 0x3f7ffffc;
    auVar115._28_4_ = 0x3f7ffffc;
    auVar101 = vmulps_avx512vl(auVar101,auVar115);
    auVar123._4_4_ = auVar87._4_4_ * auVar87._4_4_;
    auVar123._0_4_ = auVar87._0_4_ * auVar87._0_4_;
    auVar123._8_4_ = auVar87._8_4_ * auVar87._8_4_;
    auVar123._12_4_ = auVar87._12_4_ * auVar87._12_4_;
    auVar123._16_4_ = auVar87._16_4_ * auVar87._16_4_;
    auVar123._20_4_ = auVar87._20_4_ * auVar87._20_4_;
    auVar123._24_4_ = auVar87._24_4_ * auVar87._24_4_;
    auVar123._28_4_ = auVar101._28_4_;
    auVar87 = vrsqrt14ps_avx512vl(auVar117);
    auVar116._8_4_ = 0xbf000000;
    auVar116._0_8_ = 0xbf000000bf000000;
    auVar116._12_4_ = 0xbf000000;
    auVar116._16_4_ = 0xbf000000;
    auVar116._20_4_ = 0xbf000000;
    auVar116._24_4_ = 0xbf000000;
    auVar116._28_4_ = 0xbf000000;
    auVar108 = vmulps_avx512vl(auVar117,auVar116);
    auVar127._4_4_ = auVar87._4_4_ * auVar108._4_4_;
    auVar127._0_4_ = auVar87._0_4_ * auVar108._0_4_;
    auVar127._8_4_ = auVar87._8_4_ * auVar108._8_4_;
    auVar127._12_4_ = auVar87._12_4_ * auVar108._12_4_;
    auVar127._16_4_ = auVar87._16_4_ * auVar108._16_4_;
    auVar127._20_4_ = auVar87._20_4_ * auVar108._20_4_;
    auVar127._24_4_ = auVar87._24_4_ * auVar108._24_4_;
    auVar127._28_4_ = auVar108._28_4_;
    auVar108 = vmulps_avx512vl(auVar87,auVar87);
    auVar108 = vmulps_avx512vl(auVar108,auVar127);
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar87,auVar117);
    auVar129._4_4_ = auVar108._4_4_ * auVar88._4_4_;
    auVar129._0_4_ = auVar108._0_4_ * auVar88._0_4_;
    auVar129._8_4_ = auVar108._8_4_ * auVar88._8_4_;
    auVar129._12_4_ = auVar108._12_4_ * auVar88._12_4_;
    auVar129._16_4_ = auVar108._16_4_ * auVar88._16_4_;
    auVar129._20_4_ = auVar108._20_4_ * auVar88._20_4_;
    auVar129._24_4_ = auVar108._24_4_ * auVar88._24_4_;
    auVar129._28_4_ = auVar87._28_4_;
    auVar87 = vmulps_avx512vl(auVar102,auVar108);
    auVar112 = vmulps_avx512vl(auVar113,auVar108);
    auVar114 = vsubps_avx512vl(auVar130,auVar104);
    auVar115 = vsubps_avx512vl(auVar130,auVar105);
    auVar116 = vsubps_avx512vl(auVar130,local_540);
    auVar117 = vmulps_avx512vl(local_520,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar94,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar93,auVar114);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar119 = vmulps_avx512vl(local_520,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar87,auVar94);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar129,auVar93);
    auVar112 = vmulps_avx512vl(auVar116,auVar112);
    auVar87 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar114,auVar129);
    local_700 = vmulps_avx512vl(auVar119,auVar119);
    auVar112 = vsubps_avx512vl(local_1e0,local_700);
    auVar120 = vmulps_avx512vl(auVar119,auVar87);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar87,auVar87);
    local_560 = vsubps_avx512vl(auVar118,auVar120);
    auVar120 = vsubps_avx512vl(local_560,auVar123);
    auVar121 = vmulps_avx512vl(auVar117,auVar117);
    auVar118._8_4_ = 0x40800000;
    auVar118._0_8_ = 0x4080000040800000;
    auVar118._12_4_ = 0x40800000;
    auVar118._16_4_ = 0x40800000;
    auVar118._20_4_ = 0x40800000;
    auVar118._24_4_ = 0x40800000;
    auVar118._28_4_ = 0x40800000;
    _local_6e0 = vmulps_avx512vl(auVar112,auVar118);
    auVar118 = vmulps_avx512vl(_local_6e0,auVar120);
    auVar118 = vsubps_avx512vl(auVar121,auVar118);
    uVar65 = vcmpps_avx512vl(auVar118,auVar130,5);
    bVar63 = (byte)uVar65;
    if (bVar63 == 0) {
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar118);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar122 = vaddps_avx512vl(auVar112,auVar112);
      auVar123 = vrcp14ps_avx512vl(auVar122);
      auVar122 = vfnmadd213ps_avx512vl(auVar122,auVar123,auVar125);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar123,auVar123);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar123 = vxorps_avx512vl(auVar117,auVar31);
      auVar123 = vsubps_avx512vl(auVar123,auVar118);
      auVar123 = vmulps_avx512vl(auVar123,auVar122);
      auVar118 = vsubps_avx512vl(auVar118,auVar117);
      auVar118 = vmulps_avx512vl(auVar118,auVar122);
      auVar122 = vfmadd213ps_avx512vl(auVar119,auVar123,auVar87);
      local_480 = vmulps_avx512vl(auVar108,auVar122);
      auVar122 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar87);
      local_4a0 = vmulps_avx512vl(auVar108,auVar122);
      auVar155._8_4_ = 0x7f800000;
      auVar155._0_8_ = 0x7f8000007f800000;
      auVar155._12_4_ = 0x7f800000;
      auVar155._16_4_ = 0x7f800000;
      auVar155._20_4_ = 0x7f800000;
      auVar155._24_4_ = 0x7f800000;
      auVar155._28_4_ = 0x7f800000;
      auVar122 = vblendmps_avx512vl(auVar155,auVar123);
      auVar125._0_4_ =
           (uint)(bVar63 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar63 & 1) * local_4a0._0_4_;
      bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar74 * auVar122._4_4_ | (uint)!bVar74 * local_4a0._4_4_;
      bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar74 * auVar122._8_4_ | (uint)!bVar74 * local_4a0._8_4_;
      bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar74 * auVar122._12_4_ | (uint)!bVar74 * local_4a0._12_4_;
      bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar74 * auVar122._16_4_ | (uint)!bVar74 * local_4a0._16_4_;
      bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar74 * auVar122._20_4_ | (uint)!bVar74 * local_4a0._20_4_;
      bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar74 * auVar122._24_4_ | (uint)!bVar74 * local_4a0._24_4_;
      bVar74 = SUB81(uVar65 >> 7,0);
      auVar125._28_4_ = (uint)bVar74 * auVar122._28_4_ | (uint)!bVar74 * local_4a0._28_4_;
      auVar156._8_4_ = 0xff800000;
      auVar156._0_8_ = 0xff800000ff800000;
      auVar156._12_4_ = 0xff800000;
      auVar156._16_4_ = 0xff800000;
      auVar156._20_4_ = 0xff800000;
      auVar156._24_4_ = 0xff800000;
      auVar156._28_4_ = 0xff800000;
      auVar122 = vblendmps_avx512vl(auVar156,auVar118);
      auVar124._0_4_ =
           (uint)(bVar63 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar118._0_4_;
      bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar74 * auVar122._4_4_ | (uint)!bVar74 * auVar118._4_4_;
      bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar74 * auVar122._8_4_ | (uint)!bVar74 * auVar118._8_4_;
      bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar74 * auVar122._12_4_ | (uint)!bVar74 * auVar118._12_4_;
      bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar74 * auVar122._16_4_ | (uint)!bVar74 * auVar118._16_4_;
      bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar74 * auVar122._20_4_ | (uint)!bVar74 * auVar118._20_4_;
      bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar74 * auVar122._24_4_ | (uint)!bVar74 * auVar118._24_4_;
      bVar74 = SUB81(uVar65 >> 7,0);
      auVar124._28_4_ = (uint)bVar74 * auVar122._28_4_ | (uint)!bVar74 * auVar118._28_4_;
      in_ZMM31 = ZEXT3264(auVar124);
      auVar157._8_4_ = 0x7fffffff;
      auVar157._0_8_ = 0x7fffffff7fffffff;
      auVar157._12_4_ = 0x7fffffff;
      auVar157._16_4_ = 0x7fffffff;
      auVar157._20_4_ = 0x7fffffff;
      auVar157._24_4_ = 0x7fffffff;
      auVar157._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_700,auVar157);
      auVar118 = vmaxps_avx512vl(local_3e0,auVar124);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar122 = vmulps_avx512vl(auVar118,auVar32);
      auVar118 = vandps_avx(auVar112,auVar157);
      uVar64 = vcmpps_avx512vl(auVar118,auVar122,1);
      uVar65 = uVar65 & uVar64;
      bVar67 = (byte)uVar65;
      if (bVar67 != 0) {
        uVar64 = vcmpps_avx512vl(auVar120,_DAT_02020f00,2);
        auVar181._8_4_ = 0xff800000;
        auVar181._0_8_ = 0xff800000ff800000;
        auVar181._12_4_ = 0xff800000;
        auVar181._16_4_ = 0xff800000;
        auVar181._20_4_ = 0xff800000;
        auVar181._24_4_ = 0xff800000;
        auVar181._28_4_ = 0xff800000;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122 = vblendmps_avx512vl(auVar120,auVar181);
        bVar62 = (byte)uVar64;
        uVar77 = (uint)(bVar62 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar118._0_4_;
        bVar74 = (bool)((byte)(uVar64 >> 1) & 1);
        uVar140 = (uint)bVar74 * auVar122._4_4_ | (uint)!bVar74 * auVar118._4_4_;
        bVar74 = (bool)((byte)(uVar64 >> 2) & 1);
        uVar141 = (uint)bVar74 * auVar122._8_4_ | (uint)!bVar74 * auVar118._8_4_;
        bVar74 = (bool)((byte)(uVar64 >> 3) & 1);
        uVar142 = (uint)bVar74 * auVar122._12_4_ | (uint)!bVar74 * auVar118._12_4_;
        bVar74 = (bool)((byte)(uVar64 >> 4) & 1);
        uVar143 = (uint)bVar74 * auVar122._16_4_ | (uint)!bVar74 * auVar118._16_4_;
        bVar74 = (bool)((byte)(uVar64 >> 5) & 1);
        uVar144 = (uint)bVar74 * auVar122._20_4_ | (uint)!bVar74 * auVar118._20_4_;
        bVar74 = (bool)((byte)(uVar64 >> 6) & 1);
        uVar145 = (uint)bVar74 * auVar122._24_4_ | (uint)!bVar74 * auVar118._24_4_;
        bVar74 = SUB81(uVar64 >> 7,0);
        uVar146 = (uint)bVar74 * auVar122._28_4_ | (uint)!bVar74 * auVar118._28_4_;
        auVar125._0_4_ = (bVar67 & 1) * uVar77 | !(bool)(bVar67 & 1) * auVar125._0_4_;
        bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar125._4_4_ = bVar74 * uVar140 | !bVar74 * auVar125._4_4_;
        bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar125._8_4_ = bVar74 * uVar141 | !bVar74 * auVar125._8_4_;
        bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar125._12_4_ = bVar74 * uVar142 | !bVar74 * auVar125._12_4_;
        bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar125._16_4_ = bVar74 * uVar143 | !bVar74 * auVar125._16_4_;
        bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar125._20_4_ = bVar74 * uVar144 | !bVar74 * auVar125._20_4_;
        bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar125._24_4_ = bVar74 * uVar145 | !bVar74 * auVar125._24_4_;
        bVar74 = SUB81(uVar65 >> 7,0);
        auVar125._28_4_ = bVar74 * uVar146 | !bVar74 * auVar125._28_4_;
        auVar118 = vblendmps_avx512vl(auVar181,auVar120);
        bVar74 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar64 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar64 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
        bVar16 = SUB81(uVar64 >> 7,0);
        bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar17 = SUB81(uVar65 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar17 *
                                      ((uint)bVar16 * auVar118._28_4_ | !bVar16 * uVar146) |
                                      !bVar17 * auVar124._28_4_,
                                      CONCAT424((uint)bVar15 *
                                                ((uint)bVar14 * auVar118._24_4_ | !bVar14 * uVar145)
                                                | !bVar15 * auVar124._24_4_,
                                                CONCAT420((uint)bVar13 *
                                                          ((uint)bVar12 * auVar118._20_4_ |
                                                          !bVar12 * uVar144) |
                                                          !bVar13 * auVar124._20_4_,
                                                          CONCAT416((uint)bVar11 *
                                                                    ((uint)bVar10 * auVar118._16_4_
                                                                    | !bVar10 * uVar143) |
                                                                    !bVar11 * auVar124._16_4_,
                                                                    CONCAT412((uint)bVar9 *
                                                                              ((uint)bVar8 *
                                                                               auVar118._12_4_ |
                                                                              !bVar8 * uVar142) |
                                                                              !bVar9 * auVar124.
                                                  _12_4_,CONCAT48((uint)bVar7 *
                                                                  ((uint)bVar6 * auVar118._8_4_ |
                                                                  !bVar6 * uVar141) |
                                                                  !bVar7 * auVar124._8_4_,
                                                                  CONCAT44((uint)bVar5 *
                                                                           ((uint)bVar74 *
                                                                            auVar118._4_4_ |
                                                                           !bVar74 * uVar140) |
                                                                           !bVar5 * auVar124._4_4_,
                                                                           (uint)(bVar67 & 1) *
                                                                           ((uint)(bVar62 & 1) *
                                                                            auVar118._0_4_ |
                                                                           !(bool)(bVar62 & 1) *
                                                                           uVar77) | !(bool)(bVar67 
                                                  & 1) * auVar124._0_4_))))))));
        bVar63 = (~bVar67 | bVar62) & bVar63;
      }
    }
    if ((bVar63 & 0x7f) == 0) {
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar101);
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = &DAT_3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar128._16_4_ = 0x3f800000;
      auVar128._20_4_ = 0x3f800000;
      auVar128._24_4_ = 0x3f800000;
      auVar128._28_4_ = 0x3f800000;
LAB_01deae6b:
      auVar217 = ZEXT3264(auVar128);
      auVar208 = ZEXT3264(local_620);
      auVar224 = ZEXT3264(local_7c0);
      auVar251 = ZEXT3264(local_720);
      auVar252 = ZEXT3264(local_740);
    }
    else {
      fVar229 = *(float *)(ray + k * 4 + 0x100) - (float)local_670._0_4_;
      auVar158._4_4_ = fVar229;
      auVar158._0_4_ = fVar229;
      auVar158._8_4_ = fVar229;
      auVar158._12_4_ = fVar229;
      auVar158._16_4_ = fVar229;
      auVar158._20_4_ = fVar229;
      auVar158._24_4_ = fVar229;
      auVar158._28_4_ = fVar229;
      auVar118 = vminps_avx512vl(auVar158,in_ZMM31._0_32_);
      auVar59._4_4_ = fStack_1fc;
      auVar59._0_4_ = local_200;
      auVar59._8_4_ = fStack_1f8;
      auVar59._12_4_ = fStack_1f4;
      auVar59._16_4_ = fStack_1f0;
      auVar59._20_4_ = fStack_1ec;
      auVar59._24_4_ = fStack_1e8;
      auVar59._28_4_ = fStack_1e4;
      auVar120 = vmaxps_avx512vl(auVar59,auVar125);
      auVar116 = vmulps_avx512vl(auVar116,auVar246);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar245,auVar116);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar126,auVar115);
      auVar115 = vmulps_avx512vl(local_520,auVar246);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar94,auVar245);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar93,auVar126);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar116);
      vandps_avx512vl(auVar115,auVar116);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar116,auVar126,1);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar122);
      auVar114 = vxorps_avx512vl(auVar114,auVar122);
      auVar123 = vrcp14ps_avx512vl(auVar115);
      auVar127 = vxorps_avx512vl(auVar115,auVar122);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar129 = vfnmadd213ps_avx512vl(auVar123,auVar115,auVar128);
      auVar129 = vfmadd132ps_avx512vl(auVar129,auVar123,auVar123);
      auVar129 = vmulps_avx512vl(auVar129,auVar114);
      uVar23 = vcmpps_avx512vl(auVar115,auVar127,1);
      bVar67 = (byte)uVar21 | (byte)uVar23;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar129,auVar130);
      auVar131._0_4_ =
           (uint)(bVar67 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar123._0_4_;
      bVar74 = (bool)(bVar67 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar74 * auVar114._4_4_ | (uint)!bVar74 * auVar123._4_4_;
      bVar74 = (bool)(bVar67 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar74 * auVar114._8_4_ | (uint)!bVar74 * auVar123._8_4_;
      bVar74 = (bool)(bVar67 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar74 * auVar114._12_4_ | (uint)!bVar74 * auVar123._12_4_;
      bVar74 = (bool)(bVar67 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar74 * auVar114._16_4_ | (uint)!bVar74 * auVar123._16_4_;
      bVar74 = (bool)(bVar67 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar74 * auVar114._20_4_ | (uint)!bVar74 * auVar123._20_4_;
      bVar74 = (bool)(bVar67 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar74 * auVar114._24_4_ | (uint)!bVar74 * auVar123._24_4_;
      auVar131._28_4_ =
           (uint)(bVar67 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar123._28_4_;
      auVar114 = vmaxps_avx(auVar120,auVar131);
      uVar23 = vcmpps_avx512vl(auVar115,auVar127,6);
      bVar67 = (byte)uVar21 | (byte)uVar23;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132._0_4_ =
           (uint)(bVar67 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar129._0_4_;
      bVar74 = (bool)(bVar67 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar74 * auVar120._4_4_ | (uint)!bVar74 * auVar129._4_4_;
      bVar74 = (bool)(bVar67 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar74 * auVar120._8_4_ | (uint)!bVar74 * auVar129._8_4_;
      bVar74 = (bool)(bVar67 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar74 * auVar120._12_4_ | (uint)!bVar74 * auVar129._12_4_;
      bVar74 = (bool)(bVar67 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar74 * auVar120._16_4_ | (uint)!bVar74 * auVar129._16_4_;
      bVar74 = (bool)(bVar67 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar74 * auVar120._20_4_ | (uint)!bVar74 * auVar129._20_4_;
      bVar74 = (bool)(bVar67 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar74 * auVar120._24_4_ | (uint)!bVar74 * auVar129._24_4_;
      auVar132._28_4_ =
           (uint)(bVar67 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar129._28_4_;
      auVar115 = vminps_avx(auVar118,auVar132);
      auVar103 = vsubps_avx(ZEXT832(0) << 0x20,auVar103);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar118 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar118,auVar107);
      auVar42._4_4_ = auVar107._4_4_ * auVar111._4_4_;
      auVar42._0_4_ = auVar107._0_4_ * auVar111._0_4_;
      auVar42._8_4_ = auVar107._8_4_ * auVar111._8_4_;
      auVar42._12_4_ = auVar107._12_4_ * auVar111._12_4_;
      auVar42._16_4_ = auVar107._16_4_ * auVar111._16_4_;
      auVar42._20_4_ = auVar107._20_4_ * auVar111._20_4_;
      auVar42._24_4_ = auVar107._24_4_ * auVar111._24_4_;
      auVar42._28_4_ = auVar107._28_4_;
      auVar106 = vfnmsub231ps_avx512vl(auVar42,auVar110,auVar106);
      auVar103 = vfnmadd231ps_avx512vl(auVar106,auVar109,auVar103);
      auVar106 = vmulps_avx512vl(local_520,auVar111);
      auVar106 = vfnmsub231ps_avx512vl(auVar106,auVar94,auVar110);
      auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar93,auVar109);
      vandps_avx512vl(auVar106,auVar116);
      uVar21 = vcmpps_avx512vl(auVar106,auVar126,1);
      auVar103 = vxorps_avx512vl(auVar103,auVar122);
      auVar107 = vrcp14ps_avx512vl(auVar106);
      auVar109 = vxorps_avx512vl(auVar106,auVar122);
      auVar111 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar128);
      auVar80 = vfmadd132ps_fma(auVar111,auVar107,auVar107);
      fVar229 = auVar80._0_4_ * auVar103._0_4_;
      fVar236 = auVar80._4_4_ * auVar103._4_4_;
      auVar43._4_4_ = fVar236;
      auVar43._0_4_ = fVar229;
      fVar237 = auVar80._8_4_ * auVar103._8_4_;
      auVar43._8_4_ = fVar237;
      fVar238 = auVar80._12_4_ * auVar103._12_4_;
      auVar43._12_4_ = fVar238;
      fVar243 = auVar103._16_4_ * 0.0;
      auVar43._16_4_ = fVar243;
      fVar239 = auVar103._20_4_ * 0.0;
      auVar43._20_4_ = fVar239;
      fVar209 = auVar103._24_4_ * 0.0;
      auVar43._24_4_ = fVar209;
      auVar43._28_4_ = auVar103._28_4_;
      uVar23 = vcmpps_avx512vl(auVar106,auVar109,1);
      bVar67 = (byte)uVar21 | (byte)uVar23;
      auVar111 = vblendmps_avx512vl(auVar43,auVar130);
      auVar133._0_4_ =
           (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar107._0_4_;
      bVar74 = (bool)(bVar67 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar74 * auVar111._4_4_ | (uint)!bVar74 * auVar107._4_4_;
      bVar74 = (bool)(bVar67 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar74 * auVar111._8_4_ | (uint)!bVar74 * auVar107._8_4_;
      bVar74 = (bool)(bVar67 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar74 * auVar111._12_4_ | (uint)!bVar74 * auVar107._12_4_;
      bVar74 = (bool)(bVar67 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar74 * auVar111._16_4_ | (uint)!bVar74 * auVar107._16_4_;
      bVar74 = (bool)(bVar67 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar74 * auVar111._20_4_ | (uint)!bVar74 * auVar107._20_4_;
      bVar74 = (bool)(bVar67 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar74 * auVar111._24_4_ | (uint)!bVar74 * auVar107._24_4_;
      auVar133._28_4_ =
           (uint)(bVar67 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar107._28_4_;
      _local_580 = vmaxps_avx(auVar114,auVar133);
      uVar23 = vcmpps_avx512vl(auVar106,auVar109,6);
      bVar67 = (byte)uVar21 | (byte)uVar23;
      auVar134._0_4_ =
           (uint)(bVar67 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)fVar229;
      bVar74 = (bool)(bVar67 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar74 * auVar120._4_4_ | (uint)!bVar74 * (int)fVar236;
      bVar74 = (bool)(bVar67 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar74 * auVar120._8_4_ | (uint)!bVar74 * (int)fVar237;
      bVar74 = (bool)(bVar67 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar74 * auVar120._12_4_ | (uint)!bVar74 * (int)fVar238;
      bVar74 = (bool)(bVar67 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar74 * auVar120._16_4_ | (uint)!bVar74 * (int)fVar243;
      bVar74 = (bool)(bVar67 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar74 * auVar120._20_4_ | (uint)!bVar74 * (int)fVar239;
      bVar74 = (bool)(bVar67 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar74 * auVar120._24_4_ | (uint)!bVar74 * (int)fVar209;
      auVar134._28_4_ =
           (uint)(bVar67 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar103._28_4_;
      local_280 = vminps_avx(auVar115,auVar134);
      uVar21 = vcmpps_avx512vl(_local_580,local_280,2);
      bVar63 = bVar63 & 0x7f & (byte)uVar21;
      if (bVar63 == 0) goto LAB_01deae6b;
      auVar101 = vmaxps_avx(auVar118,auVar101);
      auVar103 = vminps_avx512vl(local_480,auVar128);
      auVar50 = ZEXT412(0);
      auVar106 = ZEXT1232(auVar50) << 0x20;
      auVar103 = vmaxps_avx(auVar103,ZEXT1232(auVar50) << 0x20);
      auVar107 = vminps_avx512vl(local_4a0,auVar128);
      auVar44._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar103._28_4_ + 7.0;
      local_480 = vfmadd213ps_avx512vl(auVar44,local_7a0,auVar227);
      auVar103 = vmaxps_avx(auVar107,ZEXT1232(auVar50) << 0x20);
      auVar45._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar103._28_4_ + 7.0;
      local_4a0 = vfmadd213ps_avx512vl(auVar45,local_7a0,auVar227);
      auVar46._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar46._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar46._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar46._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar46._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar46._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar46._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar46._28_4_ = local_4a0._28_4_;
      auVar101 = vsubps_avx(local_560,auVar46);
      auVar47._4_4_ = auVar101._4_4_ * (float)local_6e0._4_4_;
      auVar47._0_4_ = auVar101._0_4_ * (float)local_6e0._0_4_;
      auVar47._8_4_ = auVar101._8_4_ * fStack_6d8;
      auVar47._12_4_ = auVar101._12_4_ * fStack_6d4;
      auVar47._16_4_ = auVar101._16_4_ * fStack_6d0;
      auVar47._20_4_ = auVar101._20_4_ * fStack_6cc;
      auVar47._24_4_ = auVar101._24_4_ * fStack_6c8;
      auVar47._28_4_ = local_4a0._28_4_;
      auVar103 = vsubps_avx(auVar121,auVar47);
      uVar21 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar50) << 0x20,5);
      bVar67 = (byte)uVar21;
      if (bVar67 == 0) {
        auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar109 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar135._8_4_ = 0x7f800000;
        auVar135._0_8_ = 0x7f8000007f800000;
        auVar135._12_4_ = 0x7f800000;
        auVar135._16_4_ = 0x7f800000;
        auVar135._20_4_ = 0x7f800000;
        auVar135._24_4_ = 0x7f800000;
        auVar135._28_4_ = 0x7f800000;
        auVar136._8_4_ = 0xff800000;
        auVar136._0_8_ = 0xff800000ff800000;
        auVar136._12_4_ = 0xff800000;
        auVar136._16_4_ = 0xff800000;
        auVar136._20_4_ = 0xff800000;
        auVar136._24_4_ = 0xff800000;
        auVar136._28_4_ = 0xff800000;
      }
      else {
        auVar81 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        uVar65 = vcmpps_avx512vl(auVar103,auVar118,5);
        auVar103 = vsqrtps_avx(auVar103);
        auVar182._0_4_ = auVar112._0_4_ + auVar112._0_4_;
        auVar182._4_4_ = auVar112._4_4_ + auVar112._4_4_;
        auVar182._8_4_ = auVar112._8_4_ + auVar112._8_4_;
        auVar182._12_4_ = auVar112._12_4_ + auVar112._12_4_;
        auVar182._16_4_ = auVar112._16_4_ + auVar112._16_4_;
        auVar182._20_4_ = auVar112._20_4_ + auVar112._20_4_;
        auVar182._24_4_ = auVar112._24_4_ + auVar112._24_4_;
        auVar182._28_4_ = auVar112._28_4_ + auVar112._28_4_;
        auVar106 = vrcp14ps_avx512vl(auVar182);
        auVar107 = vfnmadd213ps_avx512vl(auVar182,auVar106,auVar128);
        auVar80 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar33._16_4_ = 0x80000000;
        auVar33._20_4_ = 0x80000000;
        auVar33._24_4_ = 0x80000000;
        auVar33._28_4_ = 0x80000000;
        auVar106 = vxorps_avx512vl(auVar117,auVar33);
        auVar106 = vsubps_avx(auVar106,auVar103);
        auVar48._4_4_ = auVar106._4_4_ * auVar80._4_4_;
        auVar48._0_4_ = auVar106._0_4_ * auVar80._0_4_;
        auVar48._8_4_ = auVar106._8_4_ * auVar80._8_4_;
        auVar48._12_4_ = auVar106._12_4_ * auVar80._12_4_;
        auVar48._16_4_ = auVar106._16_4_ * 0.0;
        auVar48._20_4_ = auVar106._20_4_ * 0.0;
        auVar48._24_4_ = auVar106._24_4_ * 0.0;
        auVar48._28_4_ = 0x3e000000;
        auVar103 = vsubps_avx512vl(auVar103,auVar117);
        auVar247._0_4_ = auVar103._0_4_ * auVar80._0_4_;
        auVar247._4_4_ = auVar103._4_4_ * auVar80._4_4_;
        auVar247._8_4_ = auVar103._8_4_ * auVar80._8_4_;
        auVar247._12_4_ = auVar103._12_4_ * auVar80._12_4_;
        auVar247._16_4_ = auVar103._16_4_ * 0.0;
        auVar247._20_4_ = auVar103._20_4_ * 0.0;
        auVar247._24_4_ = auVar103._24_4_ * 0.0;
        auVar247._28_4_ = 0;
        auVar103 = vfmadd213ps_avx512vl(auVar119,auVar48,auVar87);
        auVar49._4_4_ = auVar108._4_4_ * auVar103._4_4_;
        auVar49._0_4_ = auVar108._0_4_ * auVar103._0_4_;
        auVar49._8_4_ = auVar108._8_4_ * auVar103._8_4_;
        auVar49._12_4_ = auVar108._12_4_ * auVar103._12_4_;
        auVar49._16_4_ = auVar108._16_4_ * auVar103._16_4_;
        auVar49._20_4_ = auVar108._20_4_ * auVar103._20_4_;
        auVar49._24_4_ = auVar108._24_4_ * auVar103._24_4_;
        auVar49._28_4_ = auVar106._28_4_;
        auVar103 = vmulps_avx512vl(auVar93,auVar48);
        auVar106 = vmulps_avx512vl(auVar94,auVar48);
        auVar110 = vmulps_avx512vl(local_520,auVar48);
        auVar107 = vfmadd213ps_avx512vl(auVar88,auVar49,auVar104);
        auVar107 = vsubps_avx512vl(auVar103,auVar107);
        auVar103 = vfmadd213ps_avx512vl(auVar102,auVar49,auVar105);
        auVar109 = vsubps_avx512vl(auVar106,auVar103);
        auVar80 = vfmadd213ps_fma(auVar49,auVar113,local_540);
        auVar103 = vsubps_avx(auVar110,ZEXT1632(auVar80));
        auVar87 = vfmadd213ps_avx512vl(auVar119,auVar247,auVar87);
        auVar108 = vmulps_avx512vl(auVar108,auVar87);
        auVar87 = vmulps_avx512vl(auVar93,auVar247);
        auVar110 = vmulps_avx512vl(auVar94,auVar247);
        auVar111 = vmulps_avx512vl(local_520,auVar247);
        auVar80 = vfmadd213ps_fma(auVar88,auVar108,auVar104);
        auVar106 = vsubps_avx(auVar87,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar102,auVar108,auVar105);
        auVar87 = vsubps_avx512vl(auVar110,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar113,auVar108,local_540);
        auVar88 = vsubps_avx512vl(auVar111,ZEXT1632(auVar80));
        auVar202._8_4_ = 0x7f800000;
        auVar202._0_8_ = 0x7f8000007f800000;
        auVar202._12_4_ = 0x7f800000;
        auVar202._16_4_ = 0x7f800000;
        auVar202._20_4_ = 0x7f800000;
        auVar202._24_4_ = 0x7f800000;
        auVar202._28_4_ = 0x7f800000;
        auVar102 = vblendmps_avx512vl(auVar202,auVar48);
        bVar74 = (bool)((byte)uVar65 & 1);
        auVar135._0_4_ = (uint)bVar74 * auVar102._0_4_ | (uint)!bVar74 * auVar104._0_4_;
        bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar74 * auVar102._4_4_ | (uint)!bVar74 * auVar104._4_4_;
        bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar74 * auVar102._8_4_ | (uint)!bVar74 * auVar104._8_4_;
        bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar74 * auVar102._12_4_ | (uint)!bVar74 * auVar104._12_4_;
        bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar74 * auVar102._16_4_ | (uint)!bVar74 * auVar104._16_4_;
        bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar74 * auVar102._20_4_ | (uint)!bVar74 * auVar104._20_4_;
        bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar74 * auVar102._24_4_ | (uint)!bVar74 * auVar104._24_4_;
        bVar74 = SUB81(uVar65 >> 7,0);
        auVar135._28_4_ = (uint)bVar74 * auVar102._28_4_ | (uint)!bVar74 * auVar104._28_4_;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar102 = vblendmps_avx512vl(auVar203,auVar247);
        bVar74 = (bool)((byte)uVar65 & 1);
        auVar136._0_4_ = (uint)bVar74 * auVar102._0_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar74 * auVar102._4_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar74 * auVar102._8_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar74 * auVar102._12_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar74 * auVar102._16_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar74 * auVar102._20_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar74 * auVar102._24_4_ | (uint)!bVar74 * -0x800000;
        bVar74 = SUB81(uVar65 >> 7,0);
        auVar136._28_4_ = (uint)bVar74 * auVar102._28_4_ | (uint)!bVar74 * -0x800000;
        vandps_avx512vl(auVar116,local_700);
        auVar102 = vmaxps_avx(local_3e0,auVar136);
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar102 = vmulps_avx512vl(auVar102,auVar34);
        vandps_avx512vl(auVar112,auVar116);
        uVar64 = vcmpps_avx512vl(auVar102,auVar102,1);
        uVar65 = uVar65 & uVar64;
        bVar62 = (byte)uVar65;
        if (bVar62 != 0) {
          uVar64 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar81),2);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar101 = vblendmps_avx512vl(auVar244,auVar241);
          bVar66 = (byte)uVar64;
          uVar77 = (uint)(bVar66 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar102._0_4_;
          bVar74 = (bool)((byte)(uVar64 >> 1) & 1);
          uVar140 = (uint)bVar74 * auVar101._4_4_ | (uint)!bVar74 * auVar102._4_4_;
          bVar74 = (bool)((byte)(uVar64 >> 2) & 1);
          uVar141 = (uint)bVar74 * auVar101._8_4_ | (uint)!bVar74 * auVar102._8_4_;
          bVar74 = (bool)((byte)(uVar64 >> 3) & 1);
          uVar142 = (uint)bVar74 * auVar101._12_4_ | (uint)!bVar74 * auVar102._12_4_;
          bVar74 = (bool)((byte)(uVar64 >> 4) & 1);
          uVar143 = (uint)bVar74 * auVar101._16_4_ | (uint)!bVar74 * auVar102._16_4_;
          bVar74 = (bool)((byte)(uVar64 >> 5) & 1);
          uVar144 = (uint)bVar74 * auVar101._20_4_ | (uint)!bVar74 * auVar102._20_4_;
          bVar74 = (bool)((byte)(uVar64 >> 6) & 1);
          uVar145 = (uint)bVar74 * auVar101._24_4_ | (uint)!bVar74 * auVar102._24_4_;
          bVar74 = SUB81(uVar64 >> 7,0);
          uVar146 = (uint)bVar74 * auVar101._28_4_ | (uint)!bVar74 * auVar102._28_4_;
          auVar135._0_4_ = (bVar62 & 1) * uVar77 | !(bool)(bVar62 & 1) * auVar135._0_4_;
          bVar74 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar135._4_4_ = bVar74 * uVar140 | !bVar74 * auVar135._4_4_;
          bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar135._8_4_ = bVar74 * uVar141 | !bVar74 * auVar135._8_4_;
          bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar135._12_4_ = bVar74 * uVar142 | !bVar74 * auVar135._12_4_;
          bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar135._16_4_ = bVar74 * uVar143 | !bVar74 * auVar135._16_4_;
          bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar135._20_4_ = bVar74 * uVar144 | !bVar74 * auVar135._20_4_;
          bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar135._24_4_ = bVar74 * uVar145 | !bVar74 * auVar135._24_4_;
          bVar74 = SUB81(uVar65 >> 7,0);
          auVar135._28_4_ = bVar74 * uVar146 | !bVar74 * auVar135._28_4_;
          auVar101 = vblendmps_avx512vl(auVar241,auVar244);
          bVar74 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar64 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar64 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
          bVar11 = SUB81(uVar64 >> 7,0);
          auVar136._0_4_ =
               (uint)(bVar62 & 1) *
               ((uint)(bVar66 & 1) * auVar101._0_4_ | !(bool)(bVar66 & 1) * uVar77) |
               !(bool)(bVar62 & 1) * auVar136._0_4_;
          bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar5 * ((uint)bVar74 * auVar101._4_4_ | !bVar74 * uVar140) |
               !bVar5 * auVar136._4_4_;
          bVar74 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar74 * ((uint)bVar6 * auVar101._8_4_ | !bVar6 * uVar141) |
               !bVar74 * auVar136._8_4_;
          bVar74 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar74 * ((uint)bVar7 * auVar101._12_4_ | !bVar7 * uVar142) |
               !bVar74 * auVar136._12_4_;
          bVar74 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar136._16_4_ =
               (uint)bVar74 * ((uint)bVar8 * auVar101._16_4_ | !bVar8 * uVar143) |
               !bVar74 * auVar136._16_4_;
          bVar74 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar136._20_4_ =
               (uint)bVar74 * ((uint)bVar9 * auVar101._20_4_ | !bVar9 * uVar144) |
               !bVar74 * auVar136._20_4_;
          bVar74 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar136._24_4_ =
               (uint)bVar74 * ((uint)bVar10 * auVar101._24_4_ | !bVar10 * uVar145) |
               !bVar74 * auVar136._24_4_;
          bVar74 = SUB81(uVar65 >> 7,0);
          auVar136._28_4_ =
               (uint)bVar74 * ((uint)bVar11 * auVar101._28_4_ | !bVar11 * uVar146) |
               !bVar74 * auVar136._28_4_;
          bVar67 = (~bVar62 | bVar66) & bVar67;
        }
      }
      auVar101 = vmulps_avx512vl(local_520,auVar88);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar87);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar106);
      _local_1c0 = _local_580;
      local_1a0 = vminps_avx(local_280,auVar135);
      vandps_avx512vl(auVar101,auVar116);
      _local_4e0 = vmaxps_avx(_local_580,auVar136);
      _local_2a0 = _local_4e0;
      auVar204._8_4_ = 0x3e99999a;
      auVar204._0_8_ = 0x3e99999a3e99999a;
      auVar204._12_4_ = 0x3e99999a;
      auVar204._16_4_ = 0x3e99999a;
      auVar204._20_4_ = 0x3e99999a;
      auVar204._24_4_ = 0x3e99999a;
      auVar204._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar101,auVar204,1);
      uVar23 = vcmpps_avx512vl(_local_580,local_1a0,2);
      bVar62 = (byte)uVar23 & bVar63;
      uVar22 = vcmpps_avx512vl(_local_4e0,local_280,2);
      auVar251 = ZEXT3264(local_720);
      auVar252 = ZEXT3264(local_740);
      if ((bVar63 & ((byte)uVar22 | (byte)uVar23)) == 0) {
        auVar217 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar208 = ZEXT3264(local_620);
        auVar224 = ZEXT3264(local_7c0);
      }
      else {
        auVar101 = vmulps_avx512vl(local_520,auVar103);
        auVar101 = vfmadd213ps_avx512vl(auVar109,auVar94,auVar101);
        auVar101 = vfmadd213ps_avx512vl(auVar107,auVar93,auVar101);
        vandps_avx512vl(auVar101,auVar116);
        uVar23 = vcmpps_avx512vl(auVar101,auVar204,1);
        bVar66 = (byte)uVar23 | ~bVar67;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar101 = vpblendmd_avx512vl(auVar159,auVar35);
        local_260._0_4_ = (uint)(bVar66 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar74 = (bool)(bVar66 >> 1 & 1);
        local_260._4_4_ = (uint)bVar74 * auVar101._4_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar66 >> 2 & 1);
        local_260._8_4_ = (uint)bVar74 * auVar101._8_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar66 >> 3 & 1);
        local_260._12_4_ = (uint)bVar74 * auVar101._12_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar66 >> 4 & 1);
        local_260._16_4_ = (uint)bVar74 * auVar101._16_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar66 >> 5 & 1);
        local_260._20_4_ = (uint)bVar74 * auVar101._20_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar66 >> 6 & 1);
        local_260._24_4_ = (uint)bVar74 * auVar101._24_4_ | (uint)!bVar74 * 2;
        local_260._28_4_ = (uint)(bVar66 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_400 = vpbroadcastd_avx512vl();
        uVar23 = vpcmpd_avx512vl(local_400,local_260,5);
        bVar66 = (byte)uVar23 & bVar62;
        if (bVar66 == 0) {
          auVar220._8_4_ = 0x7fffffff;
          auVar220._0_8_ = 0x7fffffff7fffffff;
          auVar220._12_4_ = 0x7fffffff;
        }
        else {
          auVar81 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar80 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar82 = vminps_avx(auVar81,auVar78);
          auVar81 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar78 = vmaxps_avx(auVar80,auVar81);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar82,auVar187);
          auVar81 = vandps_avx(auVar78,auVar187);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar229 = auVar80._0_4_ * 1.9073486e-06;
          local_680 = vshufps_avx(auVar78,auVar78,0xff);
          local_4c0 = (float)local_580._0_4_ + (float)local_500._0_4_;
          fStack_4bc = (float)local_580._4_4_ + (float)local_500._4_4_;
          fStack_4b8 = fStack_578 + fStack_4f8;
          fStack_4b4 = fStack_574 + fStack_4f4;
          fStack_4b0 = fStack_570 + fStack_4f0;
          fStack_4ac = fStack_56c + fStack_4ec;
          fStack_4a8 = fStack_568 + fStack_4e8;
          fStack_4a4 = fStack_564 + fStack_4e4;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar101 = vblendmps_avx512vl(auVar160,_local_580);
            auVar137._0_4_ =
                 (uint)(bVar66 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar74 = (bool)(bVar66 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar74 * auVar101._4_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar66 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar74 * auVar101._8_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar66 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar74 * auVar101._12_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar66 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar74 * auVar101._16_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar66 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar74 * auVar101._20_4_ | (uint)!bVar74 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar66 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar101 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar101 = vminps_avx(auVar137,auVar101);
            auVar87 = vshufpd_avx(auVar101,auVar101,5);
            auVar101 = vminps_avx(auVar101,auVar87);
            auVar87 = vpermpd_avx2(auVar101,0x4e);
            auVar101 = vminps_avx(auVar101,auVar87);
            uVar23 = vcmpps_avx512vl(auVar137,auVar101,0);
            bVar60 = (byte)uVar23 & bVar66;
            bVar71 = bVar66;
            if (bVar60 != 0) {
              bVar71 = bVar60;
            }
            iVar24 = 0;
            for (uVar77 = (uint)bVar71; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            bVar71 = '\x01' << ((byte)iVar24 & 0x1f);
            uVar77 = *(uint *)(local_480 + (uint)(iVar24 << 2));
            fVar236 = *(float *)(local_1c0 + (uint)(iVar24 << 2));
            fVar237 = auVar19._0_4_;
            if ((float)local_770._0_4_ < 0.0) {
              fVar237 = sqrtf((float)local_770._0_4_);
            }
            auVar253 = ZEXT464(uVar77);
            bVar60 = ~bVar71;
            lVar72 = 5;
            do {
              auVar148._4_4_ = fVar236;
              auVar148._0_4_ = fVar236;
              auVar148._8_4_ = fVar236;
              auVar148._12_4_ = fVar236;
              auVar81 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_750);
              fVar243 = auVar253._0_4_;
              fVar238 = 1.0 - fVar243;
              auVar188._0_4_ = local_5e0._0_4_ * fVar243;
              auVar188._4_4_ = local_5e0._4_4_ * fVar243;
              auVar188._8_4_ = local_5e0._8_4_ * fVar243;
              auVar188._12_4_ = local_5e0._12_4_ * fVar243;
              local_560._0_16_ = ZEXT416((uint)fVar238);
              auVar210._4_4_ = fVar238;
              auVar210._0_4_ = fVar238;
              auVar210._8_4_ = fVar238;
              auVar210._12_4_ = fVar238;
              auVar80 = vfmadd231ps_fma(auVar188,auVar210,local_5a0._0_16_);
              auVar218._0_4_ = local_5c0._0_4_ * fVar243;
              auVar218._4_4_ = local_5c0._4_4_ * fVar243;
              auVar218._8_4_ = local_5c0._8_4_ * fVar243;
              auVar218._12_4_ = local_5c0._12_4_ * fVar243;
              auVar78 = vfmadd231ps_fma(auVar218,auVar210,local_5e0._0_16_);
              auVar225._0_4_ = fVar243 * (float)local_600._0_4_;
              auVar225._4_4_ = fVar243 * (float)local_600._4_4_;
              auVar225._8_4_ = fVar243 * fStack_5f8;
              auVar225._12_4_ = fVar243 * fStack_5f4;
              auVar82 = vfmadd231ps_fma(auVar225,auVar210,local_5c0._0_16_);
              auVar232._0_4_ = fVar243 * auVar78._0_4_;
              auVar232._4_4_ = fVar243 * auVar78._4_4_;
              auVar232._8_4_ = fVar243 * auVar78._8_4_;
              auVar232._12_4_ = fVar243 * auVar78._12_4_;
              auVar80 = vfmadd231ps_fma(auVar232,auVar210,auVar80);
              auVar189._0_4_ = fVar243 * auVar82._0_4_;
              auVar189._4_4_ = fVar243 * auVar82._4_4_;
              auVar189._8_4_ = fVar243 * auVar82._8_4_;
              auVar189._12_4_ = fVar243 * auVar82._12_4_;
              auVar78 = vfmadd231ps_fma(auVar189,auVar210,auVar78);
              auVar219._0_4_ = fVar243 * auVar78._0_4_;
              auVar219._4_4_ = fVar243 * auVar78._4_4_;
              auVar219._8_4_ = fVar243 * auVar78._8_4_;
              auVar219._12_4_ = fVar243 * auVar78._12_4_;
              auVar82 = vfmadd231ps_fma(auVar219,auVar80,auVar210);
              auVar80 = vsubps_avx(auVar78,auVar80);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar80,auVar25);
              local_540._0_16_ = auVar82;
              auVar80 = vsubps_avx(auVar81,auVar82);
              local_7a0._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              _local_6e0 = auVar80;
              if (auVar80._0_4_ < 0.0) {
                auVar208._0_4_ = sqrtf(auVar80._0_4_);
                auVar208._4_60_ = extraout_var;
                auVar80 = auVar208._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_630 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar238 = local_630._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar238;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar239 = auVar81._0_4_;
              local_640 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(local_630,auVar26);
              auVar81 = vfnmadd213ss_fma(local_640,local_630,ZEXT416(0x40000000));
              local_700._0_4_ = auVar80._0_4_;
              if (fVar238 < auVar82._0_4_) {
                fVar209 = sqrtf(fVar238);
                auVar80 = ZEXT416((uint)local_700._0_4_);
              }
              else {
                auVar82 = vsqrtss_avx(local_630,local_630);
                fVar209 = auVar82._0_4_;
              }
              local_760._0_4_ = fVar209;
              fVar238 = fVar239 * 1.5 + fVar238 * -0.5 * fVar239 * fVar239 * fVar239;
              local_650._0_4_ = auVar78._0_4_ * fVar238;
              local_650._4_4_ = auVar78._4_4_ * fVar238;
              local_650._8_4_ = auVar78._8_4_ * fVar238;
              local_650._12_4_ = auVar78._12_4_ * fVar238;
              auVar82 = vdpps_avx(local_7a0._0_16_,local_650,0x7f);
              auVar79 = vaddss_avx512f(auVar80,ZEXT416(0x3f800000));
              auVar149._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar149._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar149._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar149._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar85 = vsubps_avx(_local_6e0,auVar149);
              fVar239 = auVar85._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar239;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              fVar209 = auVar83._0_4_;
              uVar75 = fVar239 == 0.0;
              uVar73 = fVar239 < 0.0;
              if ((bool)uVar73) {
                local_660 = fVar238;
                fStack_65c = fVar238;
                fStack_658 = fVar238;
                fStack_654 = fVar238;
                fVar240 = sqrtf(fVar239);
                auVar80 = ZEXT416((uint)local_700._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                fVar238 = local_660;
                fVar248 = fStack_65c;
                fVar249 = fStack_658;
                fVar166 = fStack_654;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar240 = auVar85._0_4_;
                fVar248 = fVar238;
                fVar249 = fVar238;
                fVar166 = fVar238;
              }
              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar253._0_16_,
                                        local_560._0_16_);
              fVar165 = auVar85._0_4_ * 6.0;
              fVar20 = fVar243 * 6.0;
              auVar191._0_4_ = fVar20 * (float)local_600._0_4_;
              auVar191._4_4_ = fVar20 * (float)local_600._4_4_;
              auVar191._8_4_ = fVar20 * fStack_5f8;
              auVar191._12_4_ = fVar20 * fStack_5f4;
              auVar168._4_4_ = fVar165;
              auVar168._0_4_ = fVar165;
              auVar168._8_4_ = fVar165;
              auVar168._12_4_ = fVar165;
              auVar85 = vfmadd132ps_fma(auVar168,auVar191,local_5c0._0_16_);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_560._0_16_,
                                        auVar253._0_16_);
              fVar165 = auVar83._0_4_ * 6.0;
              auVar192._4_4_ = fVar165;
              auVar192._0_4_ = fVar165;
              auVar192._8_4_ = fVar165;
              auVar192._12_4_ = fVar165;
              auVar85 = vfmadd132ps_fma(auVar192,auVar85,local_5e0._0_16_);
              fVar165 = local_560._0_4_ * 6.0;
              auVar169._4_4_ = fVar165;
              auVar169._0_4_ = fVar165;
              auVar169._8_4_ = fVar165;
              auVar169._12_4_ = fVar165;
              auVar85 = vfmadd132ps_fma(auVar169,auVar85,local_5a0._0_16_);
              auVar193._0_4_ = auVar85._0_4_ * (float)local_630._0_4_;
              auVar193._4_4_ = auVar85._4_4_ * (float)local_630._0_4_;
              auVar193._8_4_ = auVar85._8_4_ * (float)local_630._0_4_;
              auVar193._12_4_ = auVar85._12_4_ * (float)local_630._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar165 = auVar85._0_4_;
              auVar170._0_4_ = auVar78._0_4_ * fVar165;
              auVar170._4_4_ = auVar78._4_4_ * fVar165;
              auVar170._8_4_ = auVar78._8_4_ * fVar165;
              auVar170._12_4_ = auVar78._12_4_ * fVar165;
              auVar85 = vsubps_avx(auVar193,auVar170);
              fVar165 = auVar81._0_4_ * (float)local_640._0_4_;
              auVar83 = vmaxss_avx(ZEXT416((uint)fVar229),
                                   ZEXT416((uint)(fVar236 * fVar237 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar78,auVar27);
              auVar194._0_4_ = fVar238 * auVar85._0_4_ * fVar165;
              auVar194._4_4_ = fVar248 * auVar85._4_4_ * fVar165;
              auVar194._8_4_ = fVar249 * auVar85._8_4_ * fVar165;
              auVar194._12_4_ = fVar166 * auVar85._12_4_ * fVar165;
              auVar81 = vdpps_avx(auVar84,local_650,0x7f);
              auVar85 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar229),auVar83);
              auVar80 = vdpps_avx(local_7a0._0_16_,auVar194,0x7f);
              vfmadd213ss_avx512f(auVar79,ZEXT416((uint)(fVar229 / (float)local_760._0_4_)),auVar85)
              ;
              fVar238 = auVar81._0_4_ + auVar80._0_4_;
              auVar80 = vdpps_avx(local_750,local_650,0x7f);
              auVar81 = vdpps_avx(local_7a0._0_16_,auVar84,0x7f);
              fVar239 = fVar209 * fVar239 * -0.5 * fVar209 * fVar209 + fVar209 * 1.5;
              auVar85 = vdpps_avx(local_7a0._0_16_,local_750,0x7f);
              auVar79 = vfnmadd231ss_avx512f(auVar81,auVar82,ZEXT416((uint)fVar238));
              auVar84 = vfnmadd231ss_avx512f(auVar85,auVar82,auVar80);
              auVar81 = vpermilps_avx(local_540._0_16_,0xff);
              fVar240 = fVar240 - auVar81._0_4_;
              auVar81 = vshufps_avx(auVar78,auVar78,0xff);
              auVar85 = vfmsub213ss_fma(auVar79,ZEXT416((uint)fVar239),auVar81);
              fVar239 = auVar84._0_4_ * fVar239;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar239));
              fVar209 = auVar79._0_4_;
              auVar233._0_4_ = fVar239 / fVar209;
              auVar233._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar85._0_4_ / fVar209;
              auVar211._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(auVar82,auVar233);
              auVar79 = vmulss_avx512f(auVar82,auVar211);
              fVar243 = fVar243 - (auVar85._0_4_ - fVar240 * (auVar80._0_4_ / fVar209));
              auVar253 = ZEXT464((uint)fVar243);
              fVar236 = fVar236 - (fVar240 * (fVar238 / fVar209) - auVar79._0_4_);
              auVar220._8_4_ = 0x7fffffff;
              auVar220._0_8_ = 0x7fffffff7fffffff;
              auVar220._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(auVar82,auVar220);
              auVar80 = vucomiss_avx512f(auVar80);
              in_ZMM31 = ZEXT1664(auVar80);
              bVar74 = true;
              if (!(bool)uVar73 && !(bool)uVar75) {
                auVar80 = vaddss_avx512f(auVar83,auVar80);
                auVar82 = vfmadd231ss_fma(auVar80,local_680,ZEXT416(0x36000000));
                auVar80 = vandps_avx(ZEXT416((uint)fVar240),auVar220);
                if (auVar80._0_4_ < auVar82._0_4_) {
                  fVar236 = fVar236 + (float)local_670._0_4_;
                  if ((((fVar147 <= fVar236) &&
                       (fVar238 = *(float *)(ray + k * 4 + 0x100), fVar236 <= fVar238)) &&
                      (0.0 <= fVar243)) && (fVar243 <= 1.0)) {
                    auVar51._12_4_ = 0;
                    auVar51._0_12_ = ZEXT812(0);
                    auVar80 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)local_6e0._0_4_));
                    fVar239 = auVar80._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar68].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar71 = true;
                      }
                      else {
                        fVar239 = fVar239 * 1.5 +
                                  (float)local_6e0._0_4_ * -0.5 * fVar239 * fVar239 * fVar239;
                        auVar171._0_4_ = local_7a0._0_4_ * fVar239;
                        auVar171._4_4_ = local_7a0._4_4_ * fVar239;
                        auVar171._8_4_ = local_7a0._8_4_ * fVar239;
                        auVar171._12_4_ = local_7a0._12_4_ * fVar239;
                        auVar82 = vfmadd213ps_fma(auVar81,auVar171,auVar78);
                        auVar80 = vshufps_avx(auVar171,auVar171,0xc9);
                        auVar81 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar172._0_4_ = auVar171._0_4_ * auVar81._0_4_;
                        auVar172._4_4_ = auVar171._4_4_ * auVar81._4_4_;
                        auVar172._8_4_ = auVar171._8_4_ * auVar81._8_4_;
                        auVar172._12_4_ = auVar171._12_4_ * auVar81._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar172,auVar78,auVar80);
                        auVar80 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar81 = vshufps_avx(auVar82,auVar82,0xc9);
                        auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                        auVar150._0_4_ = auVar82._0_4_ * auVar78._0_4_;
                        auVar150._4_4_ = auVar82._4_4_ * auVar78._4_4_;
                        auVar150._8_4_ = auVar82._8_4_ * auVar78._8_4_;
                        auVar150._12_4_ = auVar82._12_4_ * auVar78._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar150,auVar80,auVar81);
                        auVar205._8_4_ = 1;
                        auVar205._0_8_ = 0x100000001;
                        auVar205._12_4_ = 1;
                        auVar205._16_4_ = 1;
                        auVar205._20_4_ = 1;
                        auVar205._24_4_ = 1;
                        auVar205._28_4_ = 1;
                        auVar87 = vpermps_avx2(auVar205,ZEXT1632(auVar80));
                        auVar214._8_4_ = 2;
                        auVar214._0_8_ = 0x200000002;
                        auVar214._12_4_ = 2;
                        auVar214._16_4_ = 2;
                        auVar214._20_4_ = 2;
                        auVar214._24_4_ = 2;
                        auVar214._28_4_ = 2;
                        local_3a0 = vpermps_avx2(auVar214,ZEXT1632(auVar80));
                        local_380 = auVar80._0_4_;
                        local_3c0[0] = (RTCHitN)auVar87[0];
                        local_3c0[1] = (RTCHitN)auVar87[1];
                        local_3c0[2] = (RTCHitN)auVar87[2];
                        local_3c0[3] = (RTCHitN)auVar87[3];
                        local_3c0[4] = (RTCHitN)auVar87[4];
                        local_3c0[5] = (RTCHitN)auVar87[5];
                        local_3c0[6] = (RTCHitN)auVar87[6];
                        local_3c0[7] = (RTCHitN)auVar87[7];
                        local_3c0[8] = (RTCHitN)auVar87[8];
                        local_3c0[9] = (RTCHitN)auVar87[9];
                        local_3c0[10] = (RTCHitN)auVar87[10];
                        local_3c0[0xb] = (RTCHitN)auVar87[0xb];
                        local_3c0[0xc] = (RTCHitN)auVar87[0xc];
                        local_3c0[0xd] = (RTCHitN)auVar87[0xd];
                        local_3c0[0xe] = (RTCHitN)auVar87[0xe];
                        local_3c0[0xf] = (RTCHitN)auVar87[0xf];
                        local_3c0[0x10] = (RTCHitN)auVar87[0x10];
                        local_3c0[0x11] = (RTCHitN)auVar87[0x11];
                        local_3c0[0x12] = (RTCHitN)auVar87[0x12];
                        local_3c0[0x13] = (RTCHitN)auVar87[0x13];
                        local_3c0[0x14] = (RTCHitN)auVar87[0x14];
                        local_3c0[0x15] = (RTCHitN)auVar87[0x15];
                        local_3c0[0x16] = (RTCHitN)auVar87[0x16];
                        local_3c0[0x17] = (RTCHitN)auVar87[0x17];
                        local_3c0[0x18] = (RTCHitN)auVar87[0x18];
                        local_3c0[0x19] = (RTCHitN)auVar87[0x19];
                        local_3c0[0x1a] = (RTCHitN)auVar87[0x1a];
                        local_3c0[0x1b] = (RTCHitN)auVar87[0x1b];
                        local_3c0[0x1c] = (RTCHitN)auVar87[0x1c];
                        local_3c0[0x1d] = (RTCHitN)auVar87[0x1d];
                        local_3c0[0x1e] = (RTCHitN)auVar87[0x1e];
                        local_3c0[0x1f] = (RTCHitN)auVar87[0x1f];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        local_360 = fVar243;
                        fStack_35c = fVar243;
                        fStack_358 = fVar243;
                        fStack_354 = fVar243;
                        fStack_350 = fVar243;
                        fStack_34c = fVar243;
                        fStack_348 = fVar243;
                        fStack_344 = fVar243;
                        local_340 = ZEXT432(0) << 0x20;
                        local_320 = local_420._0_8_;
                        uStack_318 = local_420._8_8_;
                        uStack_310 = local_420._16_8_;
                        uStack_308 = local_420._24_8_;
                        local_300 = local_440;
                        vpcmpeqd_avx2(local_440,local_440);
                        local_2e0 = context->user->instID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        local_2c0 = context->user->instPrimID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar236;
                        local_6c0 = local_460._0_8_;
                        uStack_6b8 = local_460._8_8_;
                        uStack_6b0 = local_460._16_8_;
                        uStack_6a8 = local_460._24_8_;
                        local_7f0.valid = (int *)&local_6c0;
                        local_7f0.geometryUserPtr = pGVar3->userPtr;
                        local_7f0.context = context->user;
                        local_7f0.hit = local_3c0;
                        local_7f0.N = 8;
                        local_7f0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_7f0);
                          auVar253 = ZEXT1664(ZEXT416((uint)fVar243));
                          auVar220._8_4_ = 0x7fffffff;
                          auVar220._0_8_ = 0x7fffffff7fffffff;
                          auVar220._12_4_ = 0x7fffffff;
                          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar53._8_8_ = uStack_6b8;
                        auVar53._0_8_ = local_6c0;
                        auVar53._16_8_ = uStack_6b0;
                        auVar53._24_8_ = uStack_6a8;
                        if (auVar53 == (undefined1  [32])0x0) {
                          bVar71 = false;
                        }
                        else {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var4)(&local_7f0);
                            auVar253 = ZEXT1664(ZEXT416((uint)fVar243));
                            auVar220._8_4_ = 0x7fffffff;
                            auVar220._0_8_ = 0x7fffffff7fffffff;
                            auVar220._12_4_ = 0x7fffffff;
                            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar54._8_8_ = uStack_6b8;
                          auVar54._0_8_ = local_6c0;
                          auVar54._16_8_ = uStack_6b0;
                          auVar54._24_8_ = uStack_6a8;
                          uVar65 = vptestmd_avx512vl(auVar54,auVar54);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar74 = (bool)((byte)uVar65 & 1);
                          bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar65 >> 2) & 1);
                          bVar7 = (bool)((byte)(uVar65 >> 3) & 1);
                          bVar8 = (bool)((byte)(uVar65 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar65 >> 5) & 1);
                          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
                          bVar11 = SUB81(uVar65 >> 7,0);
                          *(uint *)(local_7f0.ray + 0x100) =
                               (uint)bVar74 * auVar87._0_4_ |
                               (uint)!bVar74 * *(int *)(local_7f0.ray + 0x100);
                          *(uint *)(local_7f0.ray + 0x104) =
                               (uint)bVar5 * auVar87._4_4_ |
                               (uint)!bVar5 * *(int *)(local_7f0.ray + 0x104);
                          *(uint *)(local_7f0.ray + 0x108) =
                               (uint)bVar6 * auVar87._8_4_ |
                               (uint)!bVar6 * *(int *)(local_7f0.ray + 0x108);
                          *(uint *)(local_7f0.ray + 0x10c) =
                               (uint)bVar7 * auVar87._12_4_ |
                               (uint)!bVar7 * *(int *)(local_7f0.ray + 0x10c);
                          *(uint *)(local_7f0.ray + 0x110) =
                               (uint)bVar8 * auVar87._16_4_ |
                               (uint)!bVar8 * *(int *)(local_7f0.ray + 0x110);
                          *(uint *)(local_7f0.ray + 0x114) =
                               (uint)bVar9 * auVar87._20_4_ |
                               (uint)!bVar9 * *(int *)(local_7f0.ray + 0x114);
                          *(uint *)(local_7f0.ray + 0x118) =
                               (uint)bVar10 * auVar87._24_4_ |
                               (uint)!bVar10 * *(int *)(local_7f0.ray + 0x118);
                          *(uint *)(local_7f0.ray + 0x11c) =
                               (uint)bVar11 * auVar87._28_4_ |
                               (uint)!bVar11 * *(int *)(local_7f0.ray + 0x11c);
                          bVar71 = auVar54 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar71 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar238;
                        }
                      }
                      bVar74 = false;
                      goto LAB_01deb751;
                    }
                  }
                  bVar74 = false;
                  bVar71 = 0;
                }
              }
LAB_01deb751:
              if (!bVar74) goto LAB_01debb68;
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
            bVar71 = 0;
LAB_01debb68:
            bVar70 = bVar70 | bVar71 & 1;
            auVar57._4_4_ = fStack_4bc;
            auVar57._0_4_ = local_4c0;
            auVar57._8_4_ = fStack_4b8;
            auVar57._12_4_ = fStack_4b4;
            auVar57._16_4_ = fStack_4b0;
            auVar57._20_4_ = fStack_4ac;
            auVar57._24_4_ = fStack_4a8;
            auVar57._28_4_ = fStack_4a4;
            uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar36._4_4_ = uVar228;
            auVar36._0_4_ = uVar228;
            auVar36._8_4_ = uVar228;
            auVar36._12_4_ = uVar228;
            auVar36._16_4_ = uVar228;
            auVar36._20_4_ = uVar228;
            auVar36._24_4_ = uVar228;
            auVar36._28_4_ = uVar228;
            uVar23 = vcmpps_avx512vl(auVar57,auVar36,2);
            bVar66 = bVar60 & bVar66 & (byte)uVar23;
            auVar253 = ZEXT3264(auVar101);
          } while (bVar66 != 0);
        }
        auVar161._0_4_ = (float)local_500._0_4_ + (float)local_4e0._0_4_;
        auVar161._4_4_ = (float)local_500._4_4_ + (float)local_4e0._4_4_;
        auVar161._8_4_ = fStack_4f8 + fStack_4d8;
        auVar161._12_4_ = fStack_4f4 + fStack_4d4;
        auVar161._16_4_ = fStack_4f0 + fStack_4d0;
        auVar161._20_4_ = fStack_4ec + fStack_4cc;
        auVar161._24_4_ = fStack_4e8 + fStack_4c8;
        auVar161._28_4_ = fStack_4e4 + fStack_4c4;
        uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar37._4_4_ = uVar228;
        auVar37._0_4_ = uVar228;
        auVar37._8_4_ = uVar228;
        auVar37._12_4_ = uVar228;
        auVar37._16_4_ = uVar228;
        auVar37._20_4_ = uVar228;
        auVar37._24_4_ = uVar228;
        auVar37._28_4_ = uVar228;
        uVar23 = vcmpps_avx512vl(auVar161,auVar37,2);
        bVar67 = (byte)uVar21 | ~bVar67;
        bVar63 = (byte)uVar22 & bVar63 & (byte)uVar23;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar101 = vpblendmd_avx512vl(auVar162,auVar38);
        local_4e0._0_4_ = (uint)(bVar67 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
        bVar74 = (bool)(bVar67 >> 1 & 1);
        local_4e0._4_4_ = (uint)bVar74 * auVar101._4_4_ | (uint)!bVar74 * 2;
        bVar74 = (bool)(bVar67 >> 2 & 1);
        fStack_4d8 = (float)((uint)bVar74 * auVar101._8_4_ | (uint)!bVar74 * 2);
        bVar74 = (bool)(bVar67 >> 3 & 1);
        fStack_4d4 = (float)((uint)bVar74 * auVar101._12_4_ | (uint)!bVar74 * 2);
        bVar74 = (bool)(bVar67 >> 4 & 1);
        fStack_4d0 = (float)((uint)bVar74 * auVar101._16_4_ | (uint)!bVar74 * 2);
        bVar74 = (bool)(bVar67 >> 5 & 1);
        fStack_4cc = (float)((uint)bVar74 * auVar101._20_4_ | (uint)!bVar74 * 2);
        bVar74 = (bool)(bVar67 >> 6 & 1);
        fStack_4c8 = (float)((uint)bVar74 * auVar101._24_4_ | (uint)!bVar74 * 2);
        fStack_4c4 = (float)((uint)(bVar67 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2)
        ;
        uVar21 = vpcmpd_avx512vl(_local_4e0,local_400,2);
        bVar67 = (byte)uVar21 & bVar63;
        if (bVar67 == 0) {
          auVar224 = ZEXT3264(local_7c0);
          auVar251 = ZEXT3264(local_720);
          auVar252 = ZEXT3264(local_740);
        }
        else {
          auVar81 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar80 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar82 = vminps_avx(auVar81,auVar78);
          auVar81 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar78 = vmaxps_avx(auVar80,auVar81);
          auVar80 = vandps_avx(auVar82,auVar220);
          auVar81 = vandps_avx(auVar78,auVar220);
          auVar80 = vmaxps_avx(auVar80,auVar81);
          auVar81 = vmovshdup_avx(auVar80);
          auVar81 = vmaxss_avx(auVar81,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar81);
          fVar229 = auVar80._0_4_ * 1.9073486e-06;
          local_680 = vshufps_avx(auVar78,auVar78,0xff);
          _local_580 = _local_2a0;
          local_4c0 = (float)local_500._0_4_ + (float)local_2a0._0_4_;
          fStack_4bc = (float)local_500._4_4_ + (float)local_2a0._4_4_;
          fStack_4b8 = fStack_4f8 + fStack_298;
          fStack_4b4 = fStack_4f4 + fStack_294;
          fStack_4b0 = fStack_4f0 + fStack_290;
          fStack_4ac = fStack_4ec + fStack_28c;
          fStack_4a8 = fStack_4e8 + fStack_288;
          fStack_4a4 = fStack_4e4 + fStack_284;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar101 = vblendmps_avx512vl(auVar163,_local_580);
            auVar138._0_4_ =
                 (uint)(bVar67 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
            bVar74 = (bool)(bVar67 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar74 * auVar101._4_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar67 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar74 * auVar101._8_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar67 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar74 * auVar101._12_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar67 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar74 * auVar101._16_4_ | (uint)!bVar74 * 0x7f800000;
            bVar74 = (bool)(bVar67 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar74 * auVar101._20_4_ | (uint)!bVar74 * 0x7f800000;
            auVar138._24_4_ =
                 (uint)(bVar67 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar101 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar101 = vminps_avx(auVar138,auVar101);
            auVar87 = vshufpd_avx(auVar101,auVar101,5);
            auVar101 = vminps_avx(auVar101,auVar87);
            auVar87 = vpermpd_avx2(auVar101,0x4e);
            auVar101 = vminps_avx(auVar101,auVar87);
            uVar21 = vcmpps_avx512vl(auVar138,auVar101,0);
            bVar71 = (byte)uVar21 & bVar67;
            bVar66 = bVar67;
            if (bVar71 != 0) {
              bVar66 = bVar71;
            }
            iVar24 = 0;
            for (uVar77 = (uint)bVar66; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar24 & 0x1f);
            uVar77 = *(uint *)(local_4a0 + (uint)(iVar24 << 2));
            fVar236 = *(float *)(local_280 + (uint)(iVar24 << 2));
            fVar237 = auVar18._0_4_;
            if ((float)local_770._0_4_ < 0.0) {
              fVar237 = sqrtf((float)local_770._0_4_);
            }
            auVar208 = ZEXT464(uVar77);
            bVar71 = ~bVar66;
            lVar72 = 5;
            do {
              auVar151._4_4_ = fVar236;
              auVar151._0_4_ = fVar236;
              auVar151._8_4_ = fVar236;
              auVar151._12_4_ = fVar236;
              auVar81 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_750);
              fVar243 = auVar208._0_4_;
              fVar238 = 1.0 - fVar243;
              auVar195._0_4_ = local_5e0._0_4_ * fVar243;
              auVar195._4_4_ = local_5e0._4_4_ * fVar243;
              auVar195._8_4_ = local_5e0._8_4_ * fVar243;
              auVar195._12_4_ = local_5e0._12_4_ * fVar243;
              local_560._0_16_ = ZEXT416((uint)fVar238);
              auVar212._4_4_ = fVar238;
              auVar212._0_4_ = fVar238;
              auVar212._8_4_ = fVar238;
              auVar212._12_4_ = fVar238;
              auVar80 = vfmadd231ps_fma(auVar195,auVar212,local_5a0._0_16_);
              auVar221._0_4_ = local_5c0._0_4_ * fVar243;
              auVar221._4_4_ = local_5c0._4_4_ * fVar243;
              auVar221._8_4_ = local_5c0._8_4_ * fVar243;
              auVar221._12_4_ = local_5c0._12_4_ * fVar243;
              auVar78 = vfmadd231ps_fma(auVar221,auVar212,local_5e0._0_16_);
              auVar226._0_4_ = fVar243 * (float)local_600._0_4_;
              auVar226._4_4_ = fVar243 * (float)local_600._4_4_;
              auVar226._8_4_ = fVar243 * fStack_5f8;
              auVar226._12_4_ = fVar243 * fStack_5f4;
              auVar82 = vfmadd231ps_fma(auVar226,auVar212,local_5c0._0_16_);
              auVar234._0_4_ = fVar243 * auVar78._0_4_;
              auVar234._4_4_ = fVar243 * auVar78._4_4_;
              auVar234._8_4_ = fVar243 * auVar78._8_4_;
              auVar234._12_4_ = fVar243 * auVar78._12_4_;
              auVar80 = vfmadd231ps_fma(auVar234,auVar212,auVar80);
              auVar196._0_4_ = fVar243 * auVar82._0_4_;
              auVar196._4_4_ = fVar243 * auVar82._4_4_;
              auVar196._8_4_ = fVar243 * auVar82._8_4_;
              auVar196._12_4_ = fVar243 * auVar82._12_4_;
              auVar78 = vfmadd231ps_fma(auVar196,auVar212,auVar78);
              auVar222._0_4_ = fVar243 * auVar78._0_4_;
              auVar222._4_4_ = fVar243 * auVar78._4_4_;
              auVar222._8_4_ = fVar243 * auVar78._8_4_;
              auVar222._12_4_ = fVar243 * auVar78._12_4_;
              auVar82 = vfmadd231ps_fma(auVar222,auVar80,auVar212);
              auVar80 = vsubps_avx(auVar78,auVar80);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar80,auVar28);
              local_540._0_16_ = auVar82;
              auVar80 = vsubps_avx(auVar81,auVar82);
              local_7a0._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              _local_6e0 = auVar80;
              if (auVar80._0_4_ < 0.0) {
                auVar217._0_4_ = sqrtf(auVar80._0_4_);
                auVar217._4_60_ = extraout_var_00;
                auVar80 = auVar217._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_630 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar238 = local_630._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar238;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              fVar239 = auVar81._0_4_;
              local_760 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(local_630,auVar29);
              auVar81 = vfnmadd213ss_fma(local_760,local_630,ZEXT416(0x40000000));
              local_640._0_4_ = auVar81._0_4_;
              local_700._0_4_ = auVar80._0_4_;
              if (fVar238 < auVar82._0_4_) {
                auVar224._0_4_ = sqrtf(fVar238);
                auVar224._4_60_ = extraout_var_01;
                auVar80 = ZEXT416((uint)local_700._0_4_);
                auVar81 = auVar224._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx512f(local_630,local_630);
              }
              fVar238 = fVar239 * 1.5 + fVar238 * -0.5 * fVar239 * fVar239 * fVar239;
              auVar152._0_4_ = auVar78._0_4_ * fVar238;
              auVar152._4_4_ = auVar78._4_4_ * fVar238;
              auVar152._8_4_ = auVar78._8_4_ * fVar238;
              auVar152._12_4_ = auVar78._12_4_ * fVar238;
              auVar82 = vdpps_avx(local_7a0._0_16_,auVar152,0x7f);
              auVar79 = vaddss_avx512f(auVar80,ZEXT416(0x3f800000));
              auVar153._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar153._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar153._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar153._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar85 = vsubps_avx(_local_6e0,auVar153);
              fVar239 = auVar85._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar239;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              fVar209 = auVar83._0_4_;
              local_650._0_4_ = fVar239 * -0.5;
              uVar75 = fVar239 == 0.0;
              uVar73 = fVar239 < 0.0;
              if ((bool)uVar73) {
                local_660 = fVar238;
                fStack_65c = fVar238;
                fStack_658 = fVar238;
                fStack_654 = fVar238;
                fVar239 = sqrtf(fVar239);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar80 = ZEXT416((uint)local_700._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                fVar238 = local_660;
                fVar240 = fStack_65c;
                fVar248 = fStack_658;
                fVar249 = fStack_654;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar239 = auVar85._0_4_;
                fVar240 = fVar238;
                fVar248 = fVar238;
                fVar249 = fVar238;
              }
              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar253 = ZEXT3264(auVar101);
              auVar251 = ZEXT3264(local_720);
              auVar252 = ZEXT3264(local_740);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar208._0_16_,
                                        local_560._0_16_);
              fVar166 = auVar85._0_4_ * 6.0;
              fVar165 = fVar243 * 6.0;
              auVar198._0_4_ = fVar165 * (float)local_600._0_4_;
              auVar198._4_4_ = fVar165 * (float)local_600._4_4_;
              auVar198._8_4_ = fVar165 * fStack_5f8;
              auVar198._12_4_ = fVar165 * fStack_5f4;
              auVar174._4_4_ = fVar166;
              auVar174._0_4_ = fVar166;
              auVar174._8_4_ = fVar166;
              auVar174._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar174,auVar198,local_5c0._0_16_);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_560._0_16_,
                                        auVar208._0_16_);
              fVar166 = auVar83._0_4_ * 6.0;
              auVar199._4_4_ = fVar166;
              auVar199._0_4_ = fVar166;
              auVar199._8_4_ = fVar166;
              auVar199._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar199,auVar85,local_5e0._0_16_);
              fVar166 = local_560._0_4_ * 6.0;
              auVar175._4_4_ = fVar166;
              auVar175._0_4_ = fVar166;
              auVar175._8_4_ = fVar166;
              auVar175._12_4_ = fVar166;
              auVar85 = vfmadd132ps_fma(auVar175,auVar85,local_5a0._0_16_);
              auVar200._0_4_ = auVar85._0_4_ * (float)local_630._0_4_;
              auVar200._4_4_ = auVar85._4_4_ * (float)local_630._0_4_;
              auVar200._8_4_ = auVar85._8_4_ * (float)local_630._0_4_;
              auVar200._12_4_ = auVar85._12_4_ * (float)local_630._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar166 = auVar85._0_4_;
              auVar176._0_4_ = auVar78._0_4_ * fVar166;
              auVar176._4_4_ = auVar78._4_4_ * fVar166;
              auVar176._8_4_ = auVar78._8_4_ * fVar166;
              auVar176._12_4_ = auVar78._12_4_ * fVar166;
              auVar85 = vsubps_avx(auVar200,auVar176);
              fVar166 = (float)local_640._0_4_ * (float)local_760._0_4_;
              auVar83 = vmaxss_avx(ZEXT416((uint)fVar229),
                                   ZEXT416((uint)(fVar236 * fVar237 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar78,auVar30);
              auVar201._0_4_ = fVar238 * auVar85._0_4_ * fVar166;
              auVar201._4_4_ = fVar240 * auVar85._4_4_ * fVar166;
              auVar201._8_4_ = fVar248 * auVar85._8_4_ * fVar166;
              auVar201._12_4_ = fVar249 * auVar85._12_4_ * fVar166;
              auVar85 = vdpps_avx(auVar84,auVar152,0x7f);
              auVar86 = vdivss_avx512f(ZEXT416((uint)fVar229),auVar81);
              auVar81 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar229),auVar83);
              auVar80 = vdpps_avx(local_7a0._0_16_,auVar201,0x7f);
              vfmadd213ss_avx512f(auVar79,auVar86,auVar81);
              fVar238 = auVar85._0_4_ + auVar80._0_4_;
              auVar80 = vdpps_avx(local_750,auVar152,0x7f);
              auVar81 = vdpps_avx(local_7a0._0_16_,auVar84,0x7f);
              fVar209 = fVar209 * (float)local_650._0_4_ * fVar209 * fVar209 + fVar209 * 1.5;
              auVar85 = vdpps_avx(local_7a0._0_16_,local_750,0x7f);
              auVar79 = vfnmadd231ss_avx512f(auVar81,auVar82,ZEXT416((uint)fVar238));
              auVar84 = vfnmadd231ss_avx512f(auVar85,auVar82,auVar80);
              auVar81 = vpermilps_avx(local_540._0_16_,0xff);
              fVar239 = fVar239 - auVar81._0_4_;
              auVar81 = vshufps_avx(auVar78,auVar78,0xff);
              auVar85 = vfmsub213ss_fma(auVar79,ZEXT416((uint)fVar209),auVar81);
              fVar209 = auVar84._0_4_ * fVar209;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar238),ZEXT416((uint)fVar209));
              fVar240 = auVar79._0_4_;
              auVar235._0_4_ = fVar209 / fVar240;
              auVar235._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar213._0_4_ = auVar85._0_4_ / fVar240;
              auVar213._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(auVar82,auVar235);
              auVar79 = vmulss_avx512f(auVar82,auVar213);
              fVar243 = fVar243 - (auVar85._0_4_ - fVar239 * (auVar80._0_4_ / fVar240));
              auVar208 = ZEXT464((uint)fVar243);
              fVar236 = fVar236 - (fVar239 * (fVar238 / fVar240) - auVar79._0_4_);
              auVar223._8_4_ = 0x7fffffff;
              auVar223._0_8_ = 0x7fffffff7fffffff;
              auVar223._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(auVar82,auVar223);
              auVar80 = vucomiss_avx512f(auVar80);
              in_ZMM31 = ZEXT1664(auVar80);
              bVar74 = true;
              if ((bool)uVar73 || (bool)uVar75) {
LAB_01dec342:
                auVar224 = ZEXT3264(local_7c0);
              }
              else {
                auVar80 = vaddss_avx512f(auVar83,auVar80);
                auVar82 = vfmadd231ss_fma(auVar80,local_680,ZEXT416(0x36000000));
                auVar80 = vandps_avx(ZEXT416((uint)fVar239),auVar223);
                if (auVar82._0_4_ <= auVar80._0_4_) goto LAB_01dec342;
                fVar236 = fVar236 + (float)local_670._0_4_;
                auVar224 = ZEXT3264(local_7c0);
                if ((((fVar236 < fVar147) ||
                     (fVar238 = *(float *)(ray + k * 4 + 0x100), fVar238 < fVar236)) ||
                    (fVar243 < 0.0)) || (1.0 < fVar243)) {
LAB_01dec33d:
                  bVar74 = false;
                  bVar66 = 0;
                }
                else {
                  auVar52._12_4_ = 0;
                  auVar52._0_12_ = ZEXT812(0);
                  auVar80 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)local_6e0._0_4_));
                  fVar239 = auVar80._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar68].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01dec33d;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar66 = true;
                  }
                  else {
                    fVar239 = fVar239 * 1.5 +
                              (float)local_6e0._0_4_ * -0.5 * fVar239 * fVar239 * fVar239;
                    auVar177._0_4_ = local_7a0._0_4_ * fVar239;
                    auVar177._4_4_ = local_7a0._4_4_ * fVar239;
                    auVar177._8_4_ = local_7a0._8_4_ * fVar239;
                    auVar177._12_4_ = local_7a0._12_4_ * fVar239;
                    auVar82 = vfmadd213ps_fma(auVar81,auVar177,auVar78);
                    auVar80 = vshufps_avx(auVar177,auVar177,0xc9);
                    auVar81 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar178._0_4_ = auVar177._0_4_ * auVar81._0_4_;
                    auVar178._4_4_ = auVar177._4_4_ * auVar81._4_4_;
                    auVar178._8_4_ = auVar177._8_4_ * auVar81._8_4_;
                    auVar178._12_4_ = auVar177._12_4_ * auVar81._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar178,auVar78,auVar80);
                    auVar80 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar81 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                    auVar154._0_4_ = auVar82._0_4_ * auVar78._0_4_;
                    auVar154._4_4_ = auVar82._4_4_ * auVar78._4_4_;
                    auVar154._8_4_ = auVar82._8_4_ * auVar78._8_4_;
                    auVar154._12_4_ = auVar82._12_4_ * auVar78._12_4_;
                    auVar80 = vfmsub231ps_fma(auVar154,auVar80,auVar81);
                    auVar206._8_4_ = 1;
                    auVar206._0_8_ = 0x100000001;
                    auVar206._12_4_ = 1;
                    auVar206._16_4_ = 1;
                    auVar206._20_4_ = 1;
                    auVar206._24_4_ = 1;
                    auVar206._28_4_ = 1;
                    auVar101 = vpermps_avx2(auVar206,ZEXT1632(auVar80));
                    auVar215._8_4_ = 2;
                    auVar215._0_8_ = 0x200000002;
                    auVar215._12_4_ = 2;
                    auVar215._16_4_ = 2;
                    auVar215._20_4_ = 2;
                    auVar215._24_4_ = 2;
                    auVar215._28_4_ = 2;
                    local_3a0 = vpermps_avx2(auVar215,ZEXT1632(auVar80));
                    local_380 = auVar80._0_4_;
                    local_3c0[0] = (RTCHitN)auVar101[0];
                    local_3c0[1] = (RTCHitN)auVar101[1];
                    local_3c0[2] = (RTCHitN)auVar101[2];
                    local_3c0[3] = (RTCHitN)auVar101[3];
                    local_3c0[4] = (RTCHitN)auVar101[4];
                    local_3c0[5] = (RTCHitN)auVar101[5];
                    local_3c0[6] = (RTCHitN)auVar101[6];
                    local_3c0[7] = (RTCHitN)auVar101[7];
                    local_3c0[8] = (RTCHitN)auVar101[8];
                    local_3c0[9] = (RTCHitN)auVar101[9];
                    local_3c0[10] = (RTCHitN)auVar101[10];
                    local_3c0[0xb] = (RTCHitN)auVar101[0xb];
                    local_3c0[0xc] = (RTCHitN)auVar101[0xc];
                    local_3c0[0xd] = (RTCHitN)auVar101[0xd];
                    local_3c0[0xe] = (RTCHitN)auVar101[0xe];
                    local_3c0[0xf] = (RTCHitN)auVar101[0xf];
                    local_3c0[0x10] = (RTCHitN)auVar101[0x10];
                    local_3c0[0x11] = (RTCHitN)auVar101[0x11];
                    local_3c0[0x12] = (RTCHitN)auVar101[0x12];
                    local_3c0[0x13] = (RTCHitN)auVar101[0x13];
                    local_3c0[0x14] = (RTCHitN)auVar101[0x14];
                    local_3c0[0x15] = (RTCHitN)auVar101[0x15];
                    local_3c0[0x16] = (RTCHitN)auVar101[0x16];
                    local_3c0[0x17] = (RTCHitN)auVar101[0x17];
                    local_3c0[0x18] = (RTCHitN)auVar101[0x18];
                    local_3c0[0x19] = (RTCHitN)auVar101[0x19];
                    local_3c0[0x1a] = (RTCHitN)auVar101[0x1a];
                    local_3c0[0x1b] = (RTCHitN)auVar101[0x1b];
                    local_3c0[0x1c] = (RTCHitN)auVar101[0x1c];
                    local_3c0[0x1d] = (RTCHitN)auVar101[0x1d];
                    local_3c0[0x1e] = (RTCHitN)auVar101[0x1e];
                    local_3c0[0x1f] = (RTCHitN)auVar101[0x1f];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    local_360 = fVar243;
                    fStack_35c = fVar243;
                    fStack_358 = fVar243;
                    fStack_354 = fVar243;
                    fStack_350 = fVar243;
                    fStack_34c = fVar243;
                    fStack_348 = fVar243;
                    fStack_344 = fVar243;
                    local_340 = ZEXT432(0) << 0x20;
                    local_320 = local_420._0_8_;
                    uStack_318 = local_420._8_8_;
                    uStack_310 = local_420._16_8_;
                    uStack_308 = local_420._24_8_;
                    local_300 = local_440;
                    vpcmpeqd_avx2(local_440,local_440);
                    local_2e0 = context->user->instID[0];
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    local_2c0 = context->user->instPrimID[0];
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    *(float *)(ray + k * 4 + 0x100) = fVar236;
                    local_6c0 = local_460._0_8_;
                    uStack_6b8 = local_460._8_8_;
                    uStack_6b0 = local_460._16_8_;
                    uStack_6a8 = local_460._24_8_;
                    local_7f0.valid = (int *)&local_6c0;
                    local_7f0.geometryUserPtr = pGVar3->userPtr;
                    local_7f0.context = context->user;
                    local_7f0.hit = local_3c0;
                    local_7f0.N = 8;
                    local_7f0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_7f0);
                      auVar208 = ZEXT1664(ZEXT416((uint)fVar243));
                      auVar252 = ZEXT3264(local_740);
                      auVar251 = ZEXT3264(local_720);
                      auVar224 = ZEXT3264(local_7c0);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar253 = ZEXT3264(auVar101);
                    }
                    auVar55._8_8_ = uStack_6b8;
                    auVar55._0_8_ = local_6c0;
                    auVar55._16_8_ = uStack_6b0;
                    auVar55._24_8_ = uStack_6a8;
                    if (auVar55 == (undefined1  [32])0x0) {
                      bVar66 = false;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_7f0);
                        auVar208 = ZEXT1664(ZEXT416((uint)fVar243));
                        auVar252 = ZEXT3264(local_740);
                        auVar251 = ZEXT3264(local_720);
                        auVar224 = ZEXT3264(local_7c0);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar253 = ZEXT3264(auVar101);
                      }
                      auVar56._8_8_ = uStack_6b8;
                      auVar56._0_8_ = local_6c0;
                      auVar56._16_8_ = uStack_6b0;
                      auVar56._24_8_ = uStack_6a8;
                      uVar65 = vptestmd_avx512vl(auVar56,auVar56);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar74 = (bool)((byte)uVar65 & 1);
                      bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar65 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar65 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar65 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar65 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
                      bVar11 = SUB81(uVar65 >> 7,0);
                      *(uint *)(local_7f0.ray + 0x100) =
                           (uint)bVar74 * auVar101._0_4_ |
                           (uint)!bVar74 * *(int *)(local_7f0.ray + 0x100);
                      *(uint *)(local_7f0.ray + 0x104) =
                           (uint)bVar5 * auVar101._4_4_ |
                           (uint)!bVar5 * *(int *)(local_7f0.ray + 0x104);
                      *(uint *)(local_7f0.ray + 0x108) =
                           (uint)bVar6 * auVar101._8_4_ |
                           (uint)!bVar6 * *(int *)(local_7f0.ray + 0x108);
                      *(uint *)(local_7f0.ray + 0x10c) =
                           (uint)bVar7 * auVar101._12_4_ |
                           (uint)!bVar7 * *(int *)(local_7f0.ray + 0x10c);
                      *(uint *)(local_7f0.ray + 0x110) =
                           (uint)bVar8 * auVar101._16_4_ |
                           (uint)!bVar8 * *(int *)(local_7f0.ray + 0x110);
                      *(uint *)(local_7f0.ray + 0x114) =
                           (uint)bVar9 * auVar101._20_4_ |
                           (uint)!bVar9 * *(int *)(local_7f0.ray + 0x114);
                      *(uint *)(local_7f0.ray + 0x118) =
                           (uint)bVar10 * auVar101._24_4_ |
                           (uint)!bVar10 * *(int *)(local_7f0.ray + 0x118);
                      *(uint *)(local_7f0.ray + 0x11c) =
                           (uint)bVar11 * auVar101._28_4_ |
                           (uint)!bVar11 * *(int *)(local_7f0.ray + 0x11c);
                      bVar66 = auVar56 != (undefined1  [32])0x0;
                    }
                    if ((bool)bVar66 == false) {
                      *(float *)(ray + k * 4 + 0x100) = fVar238;
                    }
                  }
                  bVar74 = false;
                }
              }
              if (!bVar74) goto LAB_01dec784;
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
            bVar66 = 0;
LAB_01dec784:
            bVar70 = bVar70 | bVar66 & 1;
            auVar58._4_4_ = fStack_4bc;
            auVar58._0_4_ = local_4c0;
            auVar58._8_4_ = fStack_4b8;
            auVar58._12_4_ = fStack_4b4;
            auVar58._16_4_ = fStack_4b0;
            auVar58._20_4_ = fStack_4ac;
            auVar58._24_4_ = fStack_4a8;
            auVar58._28_4_ = fStack_4a4;
            uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar39._4_4_ = uVar228;
            auVar39._0_4_ = uVar228;
            auVar39._8_4_ = uVar228;
            auVar39._12_4_ = uVar228;
            auVar39._16_4_ = uVar228;
            auVar39._20_4_ = uVar228;
            auVar39._24_4_ = uVar228;
            auVar39._28_4_ = uVar228;
            uVar21 = vcmpps_avx512vl(auVar58,auVar39,2);
            bVar67 = bVar71 & bVar67 & (byte)uVar21;
          } while (bVar67 != 0);
        }
        uVar23 = vpcmpd_avx512vl(local_400,_local_4e0,1);
        uVar22 = vpcmpd_avx512vl(local_400,local_260,1);
        auVar183._0_4_ = (float)local_500._0_4_ + (float)local_1c0._0_4_;
        auVar183._4_4_ = (float)local_500._4_4_ + (float)local_1c0._4_4_;
        auVar183._8_4_ = fStack_4f8 + fStack_1b8;
        auVar183._12_4_ = fStack_4f4 + fStack_1b4;
        auVar183._16_4_ = fStack_4f0 + fStack_1b0;
        auVar183._20_4_ = fStack_4ec + fStack_1ac;
        auVar183._24_4_ = fStack_4e8 + fStack_1a8;
        auVar183._28_4_ = fStack_4e4 + fStack_1a4;
        uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar207._4_4_ = uVar228;
        auVar207._0_4_ = uVar228;
        auVar207._8_4_ = uVar228;
        auVar207._12_4_ = uVar228;
        auVar207._16_4_ = uVar228;
        auVar207._20_4_ = uVar228;
        auVar207._24_4_ = uVar228;
        auVar207._28_4_ = uVar228;
        uVar21 = vcmpps_avx512vl(auVar183,auVar207,2);
        bVar62 = bVar62 & (byte)uVar22 & (byte)uVar21;
        auVar216._0_4_ = (float)local_500._0_4_ + (float)local_2a0._0_4_;
        auVar216._4_4_ = (float)local_500._4_4_ + (float)local_2a0._4_4_;
        auVar216._8_4_ = fStack_4f8 + fStack_298;
        auVar216._12_4_ = fStack_4f4 + fStack_294;
        auVar216._16_4_ = fStack_4f0 + fStack_290;
        auVar216._20_4_ = fStack_4ec + fStack_28c;
        auVar216._24_4_ = fStack_4e8 + fStack_288;
        auVar216._28_4_ = fStack_4e4 + fStack_284;
        uVar21 = vcmpps_avx512vl(auVar216,auVar207,2);
        bVar63 = bVar63 & (byte)uVar23 & (byte)uVar21 | bVar62;
        if (bVar63 != 0) {
          local_180[uVar61 * 0x60] = bVar63;
          bVar74 = (bool)(bVar62 >> 1 & 1);
          bVar5 = (bool)(bVar62 >> 2 & 1);
          bVar6 = (bool)(bVar62 >> 3 & 1);
          bVar7 = (bool)(bVar62 >> 4 & 1);
          bVar8 = (bool)(bVar62 >> 5 & 1);
          auStack_160[uVar61 * 0x18] =
               (uint)(bVar62 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar62 & 1) * local_2a0._0_4_;
          auStack_160[uVar61 * 0x18 + 1] =
               (uint)bVar74 * local_1c0._4_4_ | (uint)!bVar74 * local_2a0._4_4_;
          auStack_160[uVar61 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_298;
          auStack_160[uVar61 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_294;
          auStack_160[uVar61 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_290;
          auStack_160[uVar61 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_28c;
          auStack_160[uVar61 * 0x18 + 6] =
               (uint)(bVar62 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar62 >> 6) * (int)fStack_288;
          (&fStack_144)[uVar61 * 0x18] = fStack_284;
          uVar21 = vmovlps_avx(local_690);
          (&local_140)[uVar61 * 0xc] = uVar21;
          local_138[uVar61 * 0x18] = (float)((int)fVar1 + 1);
          uVar61 = (ulong)((int)uVar61 + 1);
        }
        auVar217 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar208 = ZEXT3264(local_620);
      }
    }
    do {
      if ((int)uVar61 == 0) {
        if (bVar70 != 0) {
          return bVar76;
        }
        uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar41._4_4_ = uVar228;
        auVar41._0_4_ = uVar228;
        auVar41._8_4_ = uVar228;
        auVar41._12_4_ = uVar228;
        auVar41._16_4_ = uVar228;
        auVar41._20_4_ = uVar228;
        auVar41._24_4_ = uVar228;
        auVar41._28_4_ = uVar228;
        uVar21 = vcmpps_avx512vl(local_240,auVar41,2);
        uVar68 = (uint)uVar69 & (uint)uVar21;
        uVar69 = (ulong)uVar68;
        bVar76 = uVar68 != 0;
        if (!bVar76) {
          return bVar76;
        }
        goto LAB_01dea13f;
      }
      uVar65 = (ulong)((int)uVar61 - 1);
      auVar101 = *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x18);
      auVar184._0_4_ = auVar101._0_4_ + (float)local_500._0_4_;
      auVar184._4_4_ = auVar101._4_4_ + (float)local_500._4_4_;
      auVar184._8_4_ = auVar101._8_4_ + fStack_4f8;
      auVar184._12_4_ = auVar101._12_4_ + fStack_4f4;
      auVar184._16_4_ = auVar101._16_4_ + fStack_4f0;
      auVar184._20_4_ = auVar101._20_4_ + fStack_4ec;
      auVar184._24_4_ = auVar101._24_4_ + fStack_4e8;
      auVar184._28_4_ = auVar101._28_4_ + fStack_4e4;
      uVar228 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar40._4_4_ = uVar228;
      auVar40._0_4_ = uVar228;
      auVar40._8_4_ = uVar228;
      auVar40._12_4_ = uVar228;
      auVar40._16_4_ = uVar228;
      auVar40._20_4_ = uVar228;
      auVar40._24_4_ = uVar228;
      auVar40._28_4_ = uVar228;
      uVar21 = vcmpps_avx512vl(auVar184,auVar40,2);
      uVar77 = (uint)uVar21 & (uint)local_180[uVar65 * 0x60];
      bVar63 = (byte)uVar77;
      if (uVar77 != 0) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar185,auVar101);
        auVar139._0_4_ =
             (uint)(bVar63 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)auVar101._0_4_;
        bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar74 * auVar87._4_4_ | (uint)!bVar74 * (int)auVar101._4_4_;
        bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar74 * auVar87._8_4_ | (uint)!bVar74 * (int)auVar101._8_4_;
        bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar74 * auVar87._12_4_ | (uint)!bVar74 * (int)auVar101._12_4_;
        bVar74 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar139._16_4_ = (uint)bVar74 * auVar87._16_4_ | (uint)!bVar74 * (int)auVar101._16_4_;
        bVar74 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar139._20_4_ = (uint)bVar74 * auVar87._20_4_ | (uint)!bVar74 * (int)auVar101._20_4_;
        bVar74 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar139._24_4_ = (uint)bVar74 * auVar87._24_4_ | (uint)!bVar74 * (int)auVar101._24_4_;
        auVar139._28_4_ =
             (uVar77 >> 7) * auVar87._28_4_ | (uint)!SUB41(uVar77 >> 7,0) * (int)auVar101._28_4_;
        auVar101 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar101 = vminps_avx(auVar139,auVar101);
        auVar87 = vshufpd_avx(auVar101,auVar101,5);
        auVar101 = vminps_avx(auVar101,auVar87);
        auVar87 = vpermpd_avx2(auVar101,0x4e);
        auVar101 = vminps_avx(auVar101,auVar87);
        uVar21 = vcmpps_avx512vl(auVar139,auVar101,0);
        bVar67 = (byte)uVar21 & bVar63;
        if (bVar67 != 0) {
          uVar77 = (uint)bVar67;
        }
        fVar229 = local_138[uVar65 * 0x18 + -1];
        uVar140 = 0;
        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
          uVar140 = uVar140 + 1;
        }
        fVar1 = local_138[uVar65 * 0x18];
        bVar67 = ~('\x01' << ((byte)uVar140 & 0x1f)) & bVar63;
        local_180[uVar65 * 0x60] = bVar67;
        auVar208 = ZEXT3264(local_620);
        uVar64 = uVar65;
        if (bVar67 != 0) {
          uVar64 = uVar61;
        }
        fVar236 = *(float *)(&local_140 + uVar65 * 0xc);
        auVar186._4_4_ = fVar236;
        auVar186._0_4_ = fVar236;
        auVar186._8_4_ = fVar236;
        auVar186._12_4_ = fVar236;
        auVar186._16_4_ = fVar236;
        auVar186._20_4_ = fVar236;
        auVar186._24_4_ = fVar236;
        auVar186._28_4_ = fVar236;
        fVar229 = fVar229 - fVar236;
        auVar164._4_4_ = fVar229;
        auVar164._0_4_ = fVar229;
        auVar164._8_4_ = fVar229;
        auVar164._12_4_ = fVar229;
        auVar164._16_4_ = fVar229;
        auVar164._20_4_ = fVar229;
        auVar164._24_4_ = fVar229;
        auVar164._28_4_ = fVar229;
        auVar80 = vfmadd132ps_fma(auVar164,auVar186,_DAT_02020f20);
        auVar101 = ZEXT1632(auVar80);
        local_3c0[0] = (RTCHitN)auVar101[0];
        local_3c0[1] = (RTCHitN)auVar101[1];
        local_3c0[2] = (RTCHitN)auVar101[2];
        local_3c0[3] = (RTCHitN)auVar101[3];
        local_3c0[4] = (RTCHitN)auVar101[4];
        local_3c0[5] = (RTCHitN)auVar101[5];
        local_3c0[6] = (RTCHitN)auVar101[6];
        local_3c0[7] = (RTCHitN)auVar101[7];
        local_3c0[8] = (RTCHitN)auVar101[8];
        local_3c0[9] = (RTCHitN)auVar101[9];
        local_3c0[10] = (RTCHitN)auVar101[10];
        local_3c0[0xb] = (RTCHitN)auVar101[0xb];
        local_3c0[0xc] = (RTCHitN)auVar101[0xc];
        local_3c0[0xd] = (RTCHitN)auVar101[0xd];
        local_3c0[0xe] = (RTCHitN)auVar101[0xe];
        local_3c0[0xf] = (RTCHitN)auVar101[0xf];
        local_3c0[0x10] = (RTCHitN)auVar101[0x10];
        local_3c0[0x11] = (RTCHitN)auVar101[0x11];
        local_3c0[0x12] = (RTCHitN)auVar101[0x12];
        local_3c0[0x13] = (RTCHitN)auVar101[0x13];
        local_3c0[0x14] = (RTCHitN)auVar101[0x14];
        local_3c0[0x15] = (RTCHitN)auVar101[0x15];
        local_3c0[0x16] = (RTCHitN)auVar101[0x16];
        local_3c0[0x17] = (RTCHitN)auVar101[0x17];
        local_3c0[0x18] = (RTCHitN)auVar101[0x18];
        local_3c0[0x19] = (RTCHitN)auVar101[0x19];
        local_3c0[0x1a] = (RTCHitN)auVar101[0x1a];
        local_3c0[0x1b] = (RTCHitN)auVar101[0x1b];
        local_3c0[0x1c] = (RTCHitN)auVar101[0x1c];
        local_3c0[0x1d] = (RTCHitN)auVar101[0x1d];
        local_3c0[0x1e] = (RTCHitN)auVar101[0x1e];
        local_3c0[0x1f] = (RTCHitN)auVar101[0x1f];
        local_690._8_8_ = 0;
        local_690._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar140 * 4);
        uVar65 = uVar64;
      }
      uVar61 = uVar65;
    } while (bVar63 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }